

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O1

void iterator_with_concurrent_updates_test(void)

{
  uint8_t *puVar1;
  list_elem **pplVar2;
  uint64_t *__s;
  fdb_seqnum_t *__s_00;
  bottom_up_build_ctx *__s_01;
  fdb_commit_opt_t opt;
  fdb_iterator *pfVar3;
  avl_node *paVar4;
  btree_iterator *pbVar5;
  fdb_doc *doc;
  size_t *psVar6;
  size_t keylen;
  fdb_config *pfVar7;
  long lVar8;
  undefined8 doc_00;
  undefined1 *puVar9;
  fdb_status fVar10;
  int iVar11;
  size_t sVar12;
  size_t sVar13;
  __atomic_base<unsigned_long> _Var14;
  __atomic_base<unsigned_long> _Var15;
  size_t sVar16;
  uint uVar17;
  fdb_file_handle *pfVar18;
  long lVar19;
  __atomic_base<unsigned_long> _Var20;
  fdb_kvs_handle *pfVar21;
  __atomic_base<unsigned_long> _Var22;
  __atomic_base<unsigned_long> _Var23;
  char *fconfig;
  atomic<unsigned_char> *fconfig_00;
  fdb_doc *pfVar24;
  list *doc_01;
  btreeblk_handle *pbVar25;
  fdb_kvs_handle *pfVar26;
  undefined1 *puVar27;
  undefined1 *puVar28;
  undefined1 *puVar29;
  undefined1 *puVar30;
  undefined1 *puVar31;
  undefined1 *puVar32;
  undefined1 *puVar33;
  undefined1 *puVar34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  undefined1 *puVar37;
  undefined1 *puVar38;
  undefined1 *puVar39;
  undefined1 *puVar40;
  undefined1 *puVar41;
  undefined1 *puVar42;
  undefined1 *puVar43;
  undefined1 *puVar44;
  undefined1 *puVar45;
  undefined1 *puVar46;
  undefined1 *puVar47;
  undefined1 *puVar48;
  undefined1 *puVar49;
  undefined1 *puVar50;
  undefined1 *puVar51;
  fdb_kvs_handle *pfVar52;
  fdb_doc *unaff_RBP;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar53;
  char *pcVar54;
  char *pcVar55;
  filemgr *pfVar56;
  fdb_doc *unaff_R12;
  btreeblk_handle *pbVar57;
  char *doc_02;
  long unaff_R13;
  ulong uVar58;
  char *pcVar59;
  filemgr *pfVar60;
  ulong uVar61;
  void *pvVar62;
  btree *pbVar63;
  bool bVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  fdb_doc *rdoc;
  fdb_iterator *itr;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db3;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db1;
  timeval __test_begin;
  char bodybuf [256];
  char keybuf [256];
  uint8_t auStackY_122e9 [1805];
  fdb_commit_opt_t afStackY_11bdc [4132];
  fdb_kvs_handle afStack_10ba8 [125];
  undefined8 uStack_c40;
  undefined1 auStack_c28 [8];
  fdb_config fStack_c20;
  btreeblk_handle abStack_b28 [2];
  int64_t aiStack_a28 [32];
  list_elem *aplStack_928 [33];
  timeval tStack_820;
  undefined1 auStack_810 [32];
  btreeblk_handle *apbStack_7f0 [7];
  btreeblk_handle *pbStack_7b8;
  btreeblk_handle *pbStack_7b0;
  __atomic_base<unsigned_long> _Stack_7a8;
  undefined1 auStack_7a0 [8];
  undefined1 auStack_798 [16];
  __atomic_base<unsigned_long> _Stack_788;
  atomic<unsigned_long> aStack_780;
  atomic<unsigned_long> aStack_778;
  atomic<unsigned_long> aStack_768;
  char *pcStack_760;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_758;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_750;
  filemgr *pfStack_748;
  __atomic_base<unsigned_long> _Stack_740;
  timeval tStack_738;
  fdb_kvs_config fStack_728;
  char acStack_710 [256];
  char acStack_610 [256];
  fdb_config fStack_510;
  fdb_file_handle *pfStack_418;
  fdb_doc *pfStack_410;
  long lStack_408;
  fdb_kvs_handle *pfStack_400;
  btree *pbStack_3f8;
  fdb_doc *pfStack_3f0;
  undefined1 local_3e0 [24];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [8];
  undefined1 local_3b0 [40];
  fdb_doc local_388;
  fdb_config local_330;
  fdb_doc local_238 [3];
  
  pfStack_3f0 = (fdb_doc *)0x111b98;
  gettimeofday((timeval *)(local_3b0 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_3f0 = (fdb_doc *)0x111b9d;
  memleak_start();
  local_3e0._0_8_ = (fdb_kvs_handle *)0x0;
  pfStack_3f0 = (fdb_doc *)0x111bb2;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_3f0 = (fdb_doc *)0x111bc2;
  fdb_get_default_config();
  local_330.seqtree_opt = '\x01';
  pfVar21 = (fdb_kvs_handle *)local_3b0;
  pfStack_3f0 = (fdb_doc *)0x111bd3;
  fdb_get_default_kvs_config();
  pbVar63 = (btree *)(local_3e0 + 0x10);
  pfStack_3f0 = (fdb_doc *)0x111bea;
  fdb_open((fdb_file_handle **)pbVar63,"./iterator_test1",&local_330);
  pfVar18 = (fdb_file_handle *)local_3b8;
  pfStack_3f0 = (fdb_doc *)0x111bfd;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_3e0._16_8_,(fdb_kvs_handle **)pfVar18,
             (fdb_kvs_config *)pfVar21);
  pfStack_3f0 = (fdb_doc *)0x111c13;
  fVar10 = fdb_set_log_callback
                     ((fdb_kvs_handle *)local_3b8,logCallbackFunc,"iterator_concurrent_update_test")
  ;
  if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00111ef0;
  pfVar18 = (fdb_file_handle *)(local_3c8 + 8);
  pfStack_3f0 = (fdb_doc *)0x111c32;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_3e0._16_8_,(fdb_kvs_handle **)pfVar18,
             (fdb_kvs_config *)local_3b0);
  pfStack_3f0 = (fdb_doc *)0x111c48;
  fVar10 = fdb_set_log_callback
                     ((fdb_kvs_handle *)local_3c8._8_8_,logCallbackFunc,
                      "iterator_concurrent_update_test");
  if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00111ef5;
  pfVar18 = (fdb_file_handle *)local_3c8;
  pfStack_3f0 = (fdb_doc *)0x111c67;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_3e0._16_8_,(fdb_kvs_handle **)pfVar18,
             (fdb_kvs_config *)local_3b0);
  pfStack_3f0 = (fdb_doc *)0x111c7d;
  fVar10 = fdb_set_log_callback
                     ((fdb_kvs_handle *)local_3c8._0_8_,logCallbackFunc,
                      "iterator_concurrent_update_test");
  if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00111efa;
  unaff_R12 = local_238;
  pbVar63 = (btree *)0x0;
  uVar58 = 0;
  do {
    pfStack_3f0 = (fdb_doc *)0x111caf;
    sprintf((char *)&stack0xfffffffffffffec8,"key%d",uVar58 & 0xffffffff);
    pfStack_3f0 = (fdb_doc *)0x111cc3;
    sprintf((char *)unaff_R12,"body%d",uVar58 & 0xffffffff);
    unaff_RBP = (fdb_doc *)((long)&local_388 + (long)pbVar63);
    pfStack_3f0 = (fdb_doc *)0x111cd3;
    sVar12 = strlen((char *)&stack0xfffffffffffffec8);
    pfStack_3f0 = (fdb_doc *)0x111cde;
    sVar13 = strlen((char *)unaff_R12);
    pfStack_3f0 = (fdb_doc *)0x111cf8;
    fdb_doc_create((fdb_doc **)unaff_RBP,(fdb_kvs_handle *)&stack0xfffffffffffffec8,sVar12,
                   (void *)0x0,0,unaff_R12,sVar13);
    pfStack_3f0 = (fdb_doc *)0x111d07;
    fdb_set((fdb_kvs_handle *)local_3b8,*(fdb_doc **)((long)&local_388 + uVar58 * 8));
    uVar58 = uVar58 + 1;
    pbVar63 = (btree *)((long)pbVar63 + 8);
  } while (uVar58 != 10);
  pfStack_3f0 = (fdb_doc *)0x111d23;
  fdb_commit((fdb_file_handle *)local_3e0._16_8_,'\x01');
  unaff_R13 = 0;
  pfStack_3f0 = (fdb_doc *)0x111d46;
  fdb_iterator_init((fdb_kvs_handle *)local_3c8._8_8_,(fdb_iterator **)(local_3e0 + 8),(void *)0x0,0
                    ,(void *)0x0,0,0);
  pfVar18 = (fdb_file_handle *)local_3e0;
  pfVar21 = (fdb_kvs_handle *)&stack0xfffffffffffffec8;
  do {
    pfStack_3f0 = (fdb_doc *)0x111d58;
    fVar10 = fdb_iterator_get((fdb_iterator *)local_3e0._8_8_,(fdb_doc **)pfVar18);
    doc_00 = local_3e0._0_8_;
    if (fVar10 != FDB_RESULT_SUCCESS) {
      pfStack_3f0 = (fdb_doc *)0x111ed5;
      iterator_with_concurrent_updates_test();
LAB_00111ed5:
      pfStack_3f0 = (fdb_doc *)0x111ee0;
      iterator_with_concurrent_updates_test();
LAB_00111ee0:
      pfStack_3f0 = (fdb_doc *)0x111eeb;
      iterator_with_concurrent_updates_test();
      goto LAB_00111eeb;
    }
    pbVar63 = *(btree **)(local_3e0._0_8_ + 0x20);
    unaff_RBP = *(fdb_doc **)((long)&local_388 + unaff_R13 * 8);
    unaff_R12 = (fdb_doc *)unaff_RBP->key;
    pfStack_3f0 = (fdb_doc *)0x111d80;
    iVar11 = bcmp(pbVar63,unaff_R12,*(size_t *)(fdb_kvs_config *)local_3e0._0_8_);
    pfVar21 = (fdb_kvs_handle *)doc_00;
    if (iVar11 != 0) goto LAB_00111ed5;
    pbVar63 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(doc_00 + 0x40))->seqtree;
    unaff_R12 = (fdb_doc *)unaff_RBP->body;
    pfStack_3f0 = (fdb_doc *)0x111d9f;
    iVar11 = bcmp(pbVar63,unaff_R12,(size_t)((fdb_kvs_config *)doc_00)->custom_cmp_param);
    if (iVar11 != 0) goto LAB_00111ee0;
    unaff_R13 = unaff_R13 + 1;
    pfStack_3f0 = (fdb_doc *)0x111db2;
    fdb_doc_free((fdb_doc *)doc_00);
    local_3e0._0_8_ = (fdb_kvs_handle *)0x0;
    pfStack_3f0 = (fdb_doc *)0x111dc5;
    fVar10 = fdb_iterator_next((fdb_iterator *)local_3e0._8_8_);
  } while (fVar10 == FDB_RESULT_SUCCESS);
  pfStack_3f0 = (fdb_doc *)0x111dd3;
  fdb_iterator_close((fdb_iterator *)local_3e0._8_8_);
  if (unaff_R13 != 10) goto LAB_00111eff;
  pfStack_3f0 = (fdb_doc *)0x111df3;
  fdb_iterator_sequence_init
            ((fdb_kvs_handle *)local_3c8._0_8_,(fdb_iterator **)(local_3e0 + 8),0,0,0);
  pfVar18 = (fdb_file_handle *)0x1;
  pfVar21 = (fdb_kvs_handle *)local_3e0;
  do {
    pfStack_3f0 = (fdb_doc *)0x111e0a;
    fVar10 = fdb_iterator_get((fdb_iterator *)local_3e0._8_8_,(fdb_doc **)pfVar21);
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00111eeb;
    if (pfVar18 != *(fdb_file_handle **)(local_3e0._0_8_ + 0x28)) {
      pfStack_3f0 = (fdb_doc *)0x111e4e;
      iterator_with_concurrent_updates_test();
    }
    pfStack_3f0 = (fdb_doc *)0x111e27;
    fdb_doc_free((fdb_doc *)local_3e0._0_8_);
    local_3e0._0_8_ = (fdb_kvs_handle *)0x0;
    pfStack_3f0 = (fdb_doc *)0x111e3a;
    fVar10 = fdb_iterator_next((fdb_iterator *)local_3e0._8_8_);
    pfVar18 = (fdb_file_handle *)((long)&pfVar18->root + 1);
  } while (fVar10 == FDB_RESULT_SUCCESS);
  pfStack_3f0 = (fdb_doc *)0x111e5a;
  fdb_iterator_close((fdb_iterator *)local_3e0._8_8_);
  if (pfVar18 == (fdb_file_handle *)0xb) {
    pfStack_3f0 = (fdb_doc *)0x111e6e;
    fdb_close((fdb_file_handle *)local_3e0._16_8_);
    lVar19 = 0;
    do {
      pfStack_3f0 = (fdb_doc *)0x111e7a;
      fdb_doc_free(*(fdb_doc **)((long)&local_388 + lVar19 * 8));
      lVar19 = lVar19 + 1;
    } while (lVar19 != 10);
    pfStack_3f0 = (fdb_doc *)0x111e88;
    fdb_shutdown();
    pfStack_3f0 = (fdb_doc *)0x111e8d;
    memleak_end();
    pcVar55 = "%s PASSED\n";
    if (iterator_with_concurrent_updates_test()::__test_pass != '\0') {
      pcVar55 = "%s FAILED\n";
    }
    pfStack_3f0 = (fdb_doc *)0x111ebe;
    fprintf(_stderr,pcVar55,"iterator with concurrent updates test");
    return;
  }
  goto LAB_00111f04;
LAB_00113013:
  iterator_seek_test();
  pfVar21 = (fdb_kvs_handle *)_Var20._M_i;
  _Var22._M_i = _Var14._M_i;
LAB_0011301e:
  _Var14._M_i = _Var22._M_i;
  iterator_seek_test();
LAB_00113023:
  iterator_seek_test();
LAB_0011302e:
  iterator_seek_test();
LAB_00113039:
  iterator_seek_test();
  _Var20._M_i = _Var14._M_i;
LAB_00113044:
  _Var14._M_i = _Var20._M_i;
  iterator_seek_test();
LAB_00113049:
  iterator_seek_test();
LAB_00113054:
  iterator_seek_test();
LAB_0011305f:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113064;
  iterator_seek_test();
  pfVar26 = (fdb_kvs_handle *)_Var23._M_i;
  goto LAB_00113064;
LAB_00114f8a:
  fconfig = (char *)(ulong)uVar17;
  pcVar55 = "key%06d";
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f9a;
  iterator_complete_test();
LAB_00114f9a:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114faa;
  iterator_complete_test();
LAB_00114faa:
  doc_02 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
  pcVar54 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114fba;
  iterator_complete_test();
LAB_00114fba:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114fca;
  iterator_complete_test();
LAB_00114fca:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114fda;
  iterator_complete_test();
LAB_00114fda:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114fea;
  iterator_complete_test();
LAB_00114fea:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ffa;
  iterator_complete_test();
LAB_00114ffa:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114fff;
  iterator_complete_test();
LAB_00114fff:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115004;
  iterator_complete_test();
LAB_00115004:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115009;
  iterator_complete_test();
LAB_00115009:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11500e;
  iterator_complete_test();
LAB_0011500e:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115013;
  iterator_complete_test();
LAB_00115013:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115018;
  iterator_complete_test();
LAB_00115018:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11501d;
  iterator_complete_test();
LAB_0011501d:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115022;
  iterator_complete_test();
LAB_00115022:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115027;
  iterator_complete_test();
LAB_00115027:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11502c;
  iterator_complete_test();
LAB_0011502c:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115031;
  iterator_complete_test();
LAB_00115031:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115036;
  iterator_complete_test();
LAB_00115036:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11503b;
  iterator_complete_test();
LAB_0011503b:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115040;
  iterator_complete_test();
LAB_00115040:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115050;
  iterator_complete_test();
LAB_00115050:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115060;
  iterator_complete_test();
LAB_00115060:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115070;
  iterator_complete_test();
LAB_00115070:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115080;
  iterator_complete_test();
  pfVar56 = (filemgr *)pcVar59;
LAB_00115080:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115085;
  iterator_complete_test();
LAB_00115085:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11508a;
  iterator_complete_test();
  pfVar60 = pfVar56;
LAB_0011508a:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11508f;
  iterator_complete_test();
  pfVar56 = pfVar60;
LAB_0011508f:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115094;
  iterator_complete_test();
LAB_00115094:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115099;
  iterator_complete_test();
  pfVar52 = pfVar21;
LAB_00115099:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11509e;
  iterator_complete_test();
LAB_0011509e:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150a3;
  iterator_complete_test();
LAB_001150a3:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150a8;
  iterator_complete_test();
  pcVar59 = (char *)pfVar56;
  pfVar21 = pfVar52;
LAB_001150a8:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150ad;
  iterator_complete_test();
LAB_001150ad:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150b2;
  iterator_complete_test();
  goto LAB_001150b2;
LAB_00115614:
  (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115621;
  iterator_extreme_key_test();
LAB_00115621:
  (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11562e;
  iterator_extreme_key_test();
LAB_0011562e:
  pfVar21 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt;
  pcVar55 = "0xff length %d";
  doc_02 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_cb_mask;
  (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11563b;
  pfVar52 = (fdb_kvs_handle *)doc_02;
  iterator_extreme_key_test();
  goto LAB_0011563b;
LAB_00111eeb:
  pfStack_3f0 = (fdb_doc *)0x111ef0;
  iterator_with_concurrent_updates_test();
LAB_00111ef0:
  pfStack_3f0 = (fdb_doc *)0x111ef5;
  iterator_with_concurrent_updates_test();
LAB_00111ef5:
  pfStack_3f0 = (fdb_doc *)0x111efa;
  iterator_with_concurrent_updates_test();
LAB_00111efa:
  pfStack_3f0 = (fdb_doc *)0x111eff;
  iterator_with_concurrent_updates_test();
LAB_00111eff:
  pfStack_3f0 = (fdb_doc *)0x111f04;
  iterator_with_concurrent_updates_test();
LAB_00111f04:
  pfStack_3f0 = (fdb_doc *)iterator_compact_uncommitted_db;
  iterator_with_concurrent_updates_test();
  aStack_758.seqtree = (btree *)0x111f26;
  pfStack_418 = pfVar18;
  pfStack_410 = unaff_R12;
  lStack_408 = unaff_R13;
  pfStack_400 = pfVar21;
  pbStack_3f8 = pbVar63;
  pfStack_3f0 = unaff_RBP;
  gettimeofday(&tStack_738,(__timezone_ptr_t)0x0);
  aStack_758.seqtree = (btree *)0x111f2b;
  memleak_start();
  aStack_758.seqtree = (btree *)0x111f3b;
  fdb_get_default_config();
  aStack_758.seqtree = (btree *)0x111f48;
  fdb_get_default_kvs_config();
  fStack_510.wal_threshold = 0x400;
  fStack_510.seqtree_opt = '\x01';
  fStack_510.flags = 1;
  aStack_758.seqtree = (btree *)0x111f67;
  system("rm -rf  iterator_test* > errorlog.txt");
  aStack_758.seqtree = (btree *)0x111f7e;
  fdb_open((fdb_file_handle **)&_Stack_740,"./iterator_test1",&fStack_510);
  aStack_758.seqtree = (btree *)0x111f95;
  fdb_kvs_open((fdb_file_handle *)_Stack_740._M_i,(fdb_kvs_handle **)&pfStack_748,"db1",&fStack_728)
  ;
  pcVar55 = acStack_710 + 0x100;
  aVar53.seqtree = (btree *)0x0;
  do {
    aStack_758.seqtree = (btree *)0x111fbe;
    sprintf(pcVar55,"key%d",aVar53.seqtree);
    aStack_758.seqtree = (btree *)0x111fcd;
    sprintf(acStack_710,"body%d",aVar53.seqtree);
    pcVar59 = (char *)pfStack_748;
    aStack_758.seqtree = (btree *)0x111fda;
    _Var14._M_i = strlen(pcVar55);
    aStack_758.seqtree = (btree *)0x111fe5;
    sVar12 = strlen(acStack_710);
    aStack_758.seqtree = (btree *)0x111ff9;
    fdb_set_kv((fdb_kvs_handle *)pcVar59,pcVar55,_Var14._M_i,acStack_710,sVar12);
    aVar53._0_4_ = aVar53._0_4_ + 1;
    aVar53._4_4_ = 0;
  } while (aVar53._0_4_ != 10);
  aStack_758.seqtree = (btree *)0x112014;
  fVar10 = fdb_iterator_sequence_init
                     ((fdb_kvs_handle *)pfStack_748,(fdb_iterator **)&aStack_750.seqtree,0,0,0);
  if (fVar10 == FDB_RESULT_SUCCESS) {
    _Var14._M_i = 10;
    do {
      aStack_758.seqtree = (btree *)0x11202a;
      fVar10 = fdb_iterator_next((fdb_iterator *)aStack_750.seqtree);
      uVar17 = (int)_Var14._M_i - 1;
      _Var14._M_i = (__int_type)uVar17;
    } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
    aStack_758.seqtree = (btree *)0x11203a;
    fdb_iterator_close((fdb_iterator *)aStack_750.seqtree);
    if (uVar17 != 0) goto LAB_0011215d;
    aStack_758.seqtree = (btree *)0x11204e;
    fdb_compact((fdb_file_handle *)_Stack_740._M_i,(char *)0x0);
    pcVar55 = acStack_710 + 0x100;
    aVar53.seqtree = (btree *)0x0;
    do {
      aStack_758.seqtree = (btree *)0x112077;
      sprintf(pcVar55,"key%d",aVar53.seqtree);
      aStack_758.seqtree = (btree *)0x112086;
      sprintf(acStack_710,"body%d",aVar53.seqtree);
      pcVar59 = (char *)pfStack_748;
      aStack_758.seqtree = (btree *)0x112093;
      _Var14._M_i = strlen(pcVar55);
      aStack_758.seqtree = (btree *)0x11209e;
      sVar12 = strlen(acStack_710);
      aStack_758.seqtree = (btree *)0x1120b2;
      fdb_set_kv((fdb_kvs_handle *)pcVar59,pcVar55,_Var14._M_i,acStack_710,sVar12);
      aVar53._0_4_ = aVar53._0_4_ + 1;
      aVar53._4_4_ = 0;
    } while (aVar53._0_4_ != 10);
    aStack_758.seqtree = (btree *)0x1120cd;
    fVar10 = fdb_iterator_sequence_init
                       ((fdb_kvs_handle *)pfStack_748,(fdb_iterator **)&aStack_750.seqtree,0,0,0);
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00112162;
    _Var14._M_i = 10;
    do {
      aStack_758.seqtree = (btree *)0x1120e3;
      fVar10 = fdb_iterator_next((fdb_iterator *)aStack_750.seqtree);
      uVar17 = (int)_Var14._M_i - 1;
      _Var14._M_i = (__int_type)uVar17;
    } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
    aStack_758.seqtree = (btree *)0x1120f3;
    fdb_iterator_close((fdb_iterator *)aStack_750.seqtree);
    if (uVar17 == 0) {
      aStack_758.seqtree = (btree *)0x112101;
      fdb_kvs_close((fdb_kvs_handle *)pfStack_748);
      aStack_758.seqtree = (btree *)0x11210b;
      fdb_close((fdb_file_handle *)_Stack_740._M_i);
      aStack_758.seqtree = (btree *)0x112110;
      fdb_shutdown();
      aStack_758.seqtree = (btree *)0x112115;
      memleak_end();
      pcVar55 = "%s PASSED\n";
      if (iterator_compact_uncommitted_db()::__test_pass != '\0') {
        pcVar55 = "%s FAILED\n";
      }
      aStack_758.seqtree = (btree *)0x112146;
      fprintf(_stderr,pcVar55,"iterator compact uncommitted db");
      return;
    }
  }
  else {
    aStack_758.seqtree = (btree *)0x11215d;
    iterator_compact_uncommitted_db();
LAB_0011215d:
    aStack_758.seqtree = (btree *)0x112162;
    iterator_compact_uncommitted_db();
LAB_00112162:
    aStack_758.seqtree = (btree *)0x112167;
    iterator_compact_uncommitted_db();
  }
  _Var15._M_i = (__int_type)acStack_710;
  aStack_758.seqtree = (btree *)iterator_seek_test;
  iterator_compact_uncommitted_db();
  pcVar54 = (char *)&aStack_758;
  pcStack_760 = "body%d";
  puVar27 = auStack_c28;
  puVar28 = auStack_c28;
  puVar29 = auStack_c28;
  puVar30 = auStack_c28;
  puVar31 = auStack_c28;
  puVar32 = auStack_c28;
  puVar33 = auStack_c28;
  puVar34 = auStack_c28;
  puVar35 = auStack_c28;
  puVar36 = auStack_c28;
  puVar37 = auStack_c28;
  puVar38 = auStack_c28;
  puVar39 = auStack_c28;
  puVar40 = auStack_c28;
  puVar41 = auStack_c28;
  puVar42 = auStack_c28;
  puVar43 = auStack_c28;
  puVar44 = auStack_c28;
  puVar45 = auStack_c28;
  puVar46 = auStack_c28;
  puVar47 = auStack_c28;
  puVar48 = auStack_c28;
  puVar49 = auStack_c28;
  puVar50 = auStack_c28;
  puVar51 = auStack_c28;
  pfVar52 = (fdb_kvs_handle *)auStack_c28;
  _Var23._M_i = (__int_type)auStack_c28;
  aStack_780.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var14._M_i;
  aStack_778.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var15._M_i;
  aStack_768.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)((long)acStack_710 + 0x100);
  aStack_758 = aVar53;
  gettimeofday((timeval *)(aplStack_928 + 0x21),(__timezone_ptr_t)0x0);
  memleak_start();
  _Stack_788._M_i = 0;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  _Var14._M_i = (__int_type)auStack_810;
  fdb_get_default_kvs_config();
  fStack_c20.buffercache_size = 0;
  fStack_c20.wal_threshold = 0x400;
  fStack_c20.flags = 1;
  fStack_c20.compaction_threshold = '\0';
  fStack_c20.purging_interval = 1;
  pcVar55 = auStack_7a0;
  fdb_open((fdb_file_handle **)pcVar55,"./iterator_test1",&fStack_c20);
  pfVar21 = (fdb_kvs_handle *)auStack_798;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_7a0,(fdb_kvs_handle **)pfVar21,(fdb_kvs_config *)_Var14._M_i
            );
  fVar10 = fdb_set_log_callback
                     ((fdb_kvs_handle *)auStack_798._0_8_,logCallbackFunc,"iterator_seek_test");
  pfVar26 = (fdb_kvs_handle *)auStack_c28;
  if (fVar10 == FDB_RESULT_SUCCESS) {
    fVar10 = fdb_kvs_open((fdb_file_handle *)auStack_7a0,(fdb_kvs_handle **)&_Stack_7a8,"kv1",
                          (fdb_kvs_config *)auStack_810);
    puVar9 = auStack_c28;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00113069;
    _Var20._M_i = 0;
    pcVar55 = (char *)0x0;
    do {
      pplVar2 = &abStack_b28[4].alc_list.tail;
      sprintf((char *)pplVar2,"kEy%d",(ulong)pcVar55 & 0xffffffff);
      sprintf((char *)abStack_b28,"mEta%d",(ulong)pcVar55 & 0xffffffff);
      sprintf((char *)&abStack_b28[2].ndeltanodes,"bOdy%d",(ulong)pcVar55 & 0xffffffff);
      pcVar59 = (char *)((long)&((fdb_kvs_handle *)_Var20._M_i)->kvs + (long)auStack_810);
      _Var14._M_i = strlen((char *)pplVar2);
      _Var15._M_i = strlen((char *)abStack_b28);
      sVar12 = strlen((char *)&abStack_b28[2].ndeltanodes);
      uStack_c40 = 0x1122f0;
      fdb_doc_create((fdb_doc **)pcVar59,&abStack_b28[4].alc_list.tail,_Var14._M_i,abStack_b28,
                     _Var15._M_i,&abStack_b28[2].ndeltanodes,sVar12);
      fVar10 = fdb_set((fdb_kvs_handle *)_Stack_7a8._M_i,
                       (fdb_doc *)
                       apbStack_7f0[(long)&((filemgr *)((long)pcVar55 + -0x2f0))->field_0x2ef]);
      if (fVar10 != FDB_RESULT_SUCCESS) {
        iterator_seek_test();
        goto LAB_00113013;
      }
      fdb_doc_free((fdb_doc *)
                   apbStack_7f0[(long)&((filemgr *)((long)pcVar55 + -0x2f0))->field_0x2ef]);
      pcVar55 = &((fdb_kvs_config *)&((filemgr *)pcVar55)->filename)->field_0x1;
      _Var20._M_i = (__int_type)&(((fdb_kvs_handle *)_Var20._M_i)->kvs_config).custom_cmp;
    } while (pcVar55 != (undefined1 *)0xa);
    lVar19 = 8;
    uVar58 = 1;
    do {
      pplVar2 = &abStack_b28[4].alc_list.tail;
      sprintf((char *)pplVar2,"key%d",uVar58 & 0xffffffff);
      sprintf((char *)abStack_b28,"meta%d",uVar58 & 0xffffffff);
      sprintf((char *)&abStack_b28[2].ndeltanodes,"body%d",uVar58 & 0xffffffff);
      sVar12 = strlen((char *)pplVar2);
      sVar13 = strlen((char *)abStack_b28);
      sVar16 = strlen((char *)&abStack_b28[2].ndeltanodes);
      uStack_c40 = 0x1123da;
      fdb_doc_create((fdb_doc **)(auStack_810 + lVar19 + 0x18),&abStack_b28[4].alc_list.tail,sVar12,
                     abStack_b28,sVar13,&abStack_b28[2].ndeltanodes,sVar16);
      fdb_set((fdb_kvs_handle *)auStack_798._0_8_,(fdb_doc *)apbStack_7f0[uVar58 - 1]);
      lVar19 = lVar19 + 0x10;
      bVar64 = uVar58 < 8;
      uVar58 = uVar58 + 2;
    } while (bVar64);
    fdb_commit((fdb_file_handle *)auStack_7a0,'\x01');
    lVar19 = 0;
    uVar58 = 0;
    do {
      pplVar2 = &abStack_b28[4].alc_list.tail;
      sprintf((char *)pplVar2,"key%d",uVar58 & 0xffffffff);
      sprintf((char *)abStack_b28,"meta%d",uVar58 & 0xffffffff);
      sprintf((char *)&abStack_b28[2].ndeltanodes,"body%d",uVar58 & 0xffffffff);
      pcVar59 = auStack_810 + lVar19 + 0x18;
      _Var14._M_i = strlen((char *)pplVar2);
      _Var15._M_i = strlen((char *)abStack_b28);
      sVar12 = strlen((char *)&abStack_b28[2].ndeltanodes);
      uStack_c40 = 0x1124ba;
      fdb_doc_create((fdb_doc **)pcVar59,&abStack_b28[4].alc_list.tail,_Var14._M_i,abStack_b28,
                     _Var15._M_i,&abStack_b28[2].ndeltanodes,sVar12);
      fdb_set((fdb_kvs_handle *)auStack_798._0_8_,(fdb_doc *)apbStack_7f0[uVar58 - 1]);
      pcVar55 = (char *)(uVar58 + 2);
      lVar19 = lVar19 + 0x10;
      bVar64 = uVar58 < 8;
      uVar58 = (ulong)pcVar55;
    } while (bVar64);
    fdb_commit((fdb_file_handle *)auStack_7a0,'\0');
    uStack_c40 = 0x11250f;
    fdb_iterator_init((fdb_kvs_handle *)auStack_798._0_8_,(fdb_iterator **)(auStack_798 + 8),
                      (void *)0x0,0,(void *)0x0,0,0);
    fVar10 = fdb_iterator_get((fdb_iterator *)auStack_798._8_8_,(fdb_doc **)&_Stack_788);
    _Var20._M_i = _Stack_788._M_i;
    pbVar57 = (btreeblk_handle *)auStack_810._24_8_;
    pfVar21 = (fdb_kvs_handle *)(auStack_798 + 8);
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011306e;
    _Var14._M_i = *(__int_type *)(_Stack_788._M_i + 0x20);
    pcVar55 = (char *)((list *)(auStack_810._24_8_ + 0x18))->tail;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,*(size_t *)_Stack_788._M_i);
    puVar9 = auStack_c28;
    if (iVar11 != 0) goto LAB_00113073;
    _Var14._M_i = *(__int_type *)(_Var20._M_i + 0x38);
    pcVar55 = *(char **)((long)pbVar57 + 0x38);
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,(size_t)*(fdb_custom_cmp_variable *)(_Var20._M_i + 8))
    ;
    if (iVar11 != 0) goto LAB_0011307e;
    _Var14._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var20._M_i + 0x40))->seqtree;
    pcVar55 = *(char **)((long)pbVar57 + 0x40);
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,
                  (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var20._M_i + 0x10));
    puVar9 = auStack_c28;
    if (iVar11 != 0) goto LAB_00113089;
    fdb_doc_free((fdb_doc *)_Var20._M_i);
    _Var20._M_i = auStack_798._8_8_;
    _Stack_788._M_i = 0;
    _Var14._M_i = (__int_type)(apbStack_7f0[1]->alc_list).tail;
    sVar12 = strlen((char *)&abStack_b28[4].alc_list.tail);
    fVar10 = fdb_iterator_seek((fdb_iterator *)_Var20._M_i,(void *)_Var14._M_i,sVar12,'\0');
    if (fVar10 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00113094;
    fVar10 = fdb_iterator_get((fdb_iterator *)auStack_798._8_8_,(fdb_doc **)&_Stack_788);
    _Var15._M_i = _Stack_788._M_i;
    pbVar25 = apbStack_7f0[1];
    puVar9 = auStack_c28;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00113099;
    _Var14._M_i = *(__int_type *)(_Stack_788._M_i + 0x20);
    pcVar55 = (char *)(apbStack_7f0[1]->alc_list).tail;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,*(size_t *)_Stack_788._M_i);
    if (iVar11 != 0) goto LAB_0011309e;
    _Var14._M_i = *(__int_type *)(_Var15._M_i + 0x38);
    pcVar55 = (char *)pbVar25->file;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,(size_t)*(fdb_custom_cmp_variable *)(_Var15._M_i + 8))
    ;
    puVar9 = auStack_c28;
    if (iVar11 != 0) goto LAB_001130a9;
    _Var14._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var15._M_i + 0x40))->seqtree;
    pcVar55 = (char *)pbVar25->log_callback;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,
                  (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var15._M_i + 0x10));
    if (iVar11 != 0) goto LAB_001130b4;
    fdb_doc_free((fdb_doc *)_Var15._M_i);
    _Stack_788._M_i = 0;
    fVar10 = fdb_iterator_next((fdb_iterator *)auStack_798._8_8_);
    puVar9 = auStack_c28;
    if (fVar10 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001130bf;
    fVar10 = fdb_iterator_get((fdb_iterator *)auStack_798._8_8_,(fdb_doc **)&_Stack_788);
    _Var20._M_i = _Stack_788._M_i;
    pbVar57 = apbStack_7f0[2];
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001130c4;
    _Var14._M_i = *(__int_type *)(_Stack_788._M_i + 0x20);
    pcVar55 = (char *)(apbStack_7f0[2]->alc_list).tail;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,*(size_t *)_Stack_788._M_i);
    puVar9 = auStack_c28;
    if (iVar11 != 0) goto LAB_001130c9;
    _Var14._M_i = *(__int_type *)(_Var20._M_i + 0x38);
    pcVar55 = (char *)pbVar57->file;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,(size_t)*(fdb_custom_cmp_variable *)(_Var20._M_i + 8))
    ;
    if (iVar11 != 0) goto LAB_001130d4;
    _Var14._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var20._M_i + 0x40))->seqtree;
    pcVar55 = (char *)pbVar57->log_callback;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,
                  (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var20._M_i + 0x10));
    puVar9 = auStack_c28;
    if (iVar11 != 0) goto LAB_001130df;
    fdb_doc_free((fdb_doc *)_Var20._M_i);
    _Var20._M_i = auStack_798._8_8_;
    _Stack_788._M_i = 0;
    _Var14._M_i = (__int_type)(pbStack_7b0->alc_list).tail;
    sVar12 = strlen((char *)&abStack_b28[4].alc_list.tail);
    fVar10 = fdb_iterator_seek((fdb_iterator *)_Var20._M_i,(void *)_Var14._M_i,sVar12,'\0');
    if (fVar10 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001130ea;
    fVar10 = fdb_iterator_get((fdb_iterator *)auStack_798._8_8_,(fdb_doc **)&_Stack_788);
    _Var22._M_i = _Stack_788._M_i;
    pbVar25 = pbStack_7b0;
    puVar9 = auStack_c28;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001130ef;
    _Var14._M_i = *(__int_type *)(_Stack_788._M_i + 0x20);
    pcVar55 = (char *)(pbStack_7b0->alc_list).tail;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,*(size_t *)_Stack_788._M_i);
    if (iVar11 != 0) goto LAB_001130f4;
    _Var14._M_i = *(__int_type *)(_Var22._M_i + 0x38);
    pcVar55 = (char *)pbVar25->file;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,(size_t)*(fdb_custom_cmp_variable *)(_Var22._M_i + 8))
    ;
    puVar9 = auStack_c28;
    if (iVar11 != 0) goto LAB_001130ff;
    _Var14._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var22._M_i + 0x40))->seqtree;
    pcVar55 = (char *)pbVar25->log_callback;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,
                  (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var22._M_i + 0x10));
    if (iVar11 != 0) goto LAB_0011310a;
    fdb_doc_free((fdb_doc *)_Var22._M_i);
    _Var22._M_i = auStack_798._8_8_;
    _Stack_788._M_i = 0;
    _Var14._M_i = (__int_type)((list *)(auStack_810._24_8_ + 0x18))->tail;
    sVar12 = strlen((char *)&abStack_b28[4].alc_list.tail);
    fVar10 = fdb_iterator_seek((fdb_iterator *)_Var22._M_i,(void *)_Var14._M_i,sVar12,'\0');
    puVar9 = auStack_c28;
    if (fVar10 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00113115;
    fVar10 = fdb_iterator_get((fdb_iterator *)auStack_798._8_8_,(fdb_doc **)&_Stack_788);
    _Var20._M_i = _Stack_788._M_i;
    _Var15._M_i = auStack_810._24_8_;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011311a;
    _Var14._M_i = *(__int_type *)(_Stack_788._M_i + 0x20);
    pcVar55 = (char *)((list *)(auStack_810._24_8_ + 0x18))->tail;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,*(size_t *)_Stack_788._M_i);
    puVar9 = auStack_c28;
    if (iVar11 != 0) goto LAB_0011311f;
    _Var14._M_i = *(__int_type *)(_Var20._M_i + 0x38);
    pcVar55 = *(char **)(_Var15._M_i + 0x38);
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,(size_t)*(fdb_custom_cmp_variable *)(_Var20._M_i + 8))
    ;
    if (iVar11 != 0) goto LAB_0011312a;
    _Var14._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var20._M_i + 0x40))->seqtree;
    pcVar55 = *(char **)(_Var15._M_i + 0x40);
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,
                  (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var20._M_i + 0x10));
    puVar9 = auStack_c28;
    if (iVar11 != 0) goto LAB_00113135;
    fdb_doc_free((fdb_doc *)_Var20._M_i);
    _Var20._M_i = auStack_798._8_8_;
    _Stack_788._M_i = 0;
    _Var14._M_i = (__int_type)(apbStack_7f0[1]->alc_list).tail;
    sVar12 = strlen((char *)&abStack_b28[4].alc_list.tail);
    fVar10 = fdb_iterator_seek((fdb_iterator *)_Var20._M_i,(void *)_Var14._M_i,sVar12,'\0');
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00113140;
    pcVar59 = (char *)0x2;
    _Var22._M_i = _Var14._M_i;
    do {
      fVar10 = fdb_iterator_get((fdb_iterator *)auStack_798._8_8_,(fdb_doc **)&_Stack_788);
      _Var14._M_i = _Stack_788._M_i;
      pfVar21 = (fdb_kvs_handle *)_Var20._M_i;
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011301e;
      pcVar55 = *(char **)(_Stack_788._M_i + 0x20);
      _Var20._M_i = (__int_type)
                    apbStack_7f0[(long)&((filemgr *)((long)pcVar59 + -0x2f0))->field_0x2ef];
      _Var15._M_i = (__int_type)((fdb_kvs_handle *)_Var20._M_i)->op_stats;
      iVar11 = bcmp(pcVar55,(void *)_Var15._M_i,*(size_t *)_Stack_788._M_i);
      if (iVar11 != 0) goto LAB_00113013;
      pcVar55 = *(char **)(_Var14._M_i + 0x38);
      _Var15._M_i = (__int_type)((fdb_kvs_handle *)_Var20._M_i)->staletree;
      iVar11 = bcmp(pcVar55,(void *)_Var15._M_i,
                    (size_t)*(fdb_custom_cmp_variable *)(_Var14._M_i + 8));
      pfVar21 = (fdb_kvs_handle *)_Var20._M_i;
      if (iVar11 != 0) goto LAB_0011302e;
      pcVar55 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var14._M_i + 0x40))->
                        seqtree;
      _Var15._M_i = (__int_type)(((fdb_kvs_handle *)_Var20._M_i)->field_6).seqtree;
      iVar11 = bcmp(pcVar55,(void *)_Var15._M_i,
                    (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var14._M_i + 0x10));
      if (iVar11 != 0) goto LAB_00113023;
      fdb_doc_free((fdb_doc *)_Var14._M_i);
      _Stack_788._M_i = 0;
      pcVar59 = &((fdb_kvs_config *)&((filemgr *)pcVar59)->filename)->field_0x1;
      fVar10 = fdb_iterator_next((fdb_iterator *)auStack_798._8_8_);
      pfVar21 = (fdb_kvs_handle *)auStack_798._8_8_;
      _Var22._M_i = _Var14._M_i;
    } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
    puVar9 = auStack_c28;
    if ((uint8_t *)pcVar59 != (uint8_t *)0xa) goto LAB_00113145;
    _Var14._M_i = (__int_type)(apbStack_7f0[2]->alc_list).tail;
    sVar12 = strlen((char *)&abStack_b28[4].alc_list.tail);
    fVar10 = fdb_iterator_seek((fdb_iterator *)pfVar21,(void *)_Var14._M_i,sVar12,'\0');
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011314a;
    pcVar59 = (char *)0x3;
    _Var20._M_i = _Var14._M_i;
    do {
      fVar10 = fdb_iterator_get((fdb_iterator *)auStack_798._8_8_,(fdb_doc **)&_Stack_788);
      _Var14._M_i = _Stack_788._M_i;
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00113044;
      pcVar55 = *(char **)(_Stack_788._M_i + 0x20);
      pfVar21 = (fdb_kvs_handle *)
                apbStack_7f0[(long)&((filemgr *)((long)pcVar59 + -0x2f0))->field_0x2ef];
      _Var15._M_i = (__int_type)pfVar21->op_stats;
      iVar11 = bcmp(pcVar55,(void *)_Var15._M_i,*(size_t *)_Stack_788._M_i);
      if (iVar11 != 0) goto LAB_00113039;
      pcVar55 = *(char **)(_Var14._M_i + 0x38);
      _Var15._M_i = (__int_type)pfVar21->staletree;
      iVar11 = bcmp(pcVar55,(void *)_Var15._M_i,
                    (size_t)*(fdb_custom_cmp_variable *)(_Var14._M_i + 8));
      if (iVar11 != 0) goto LAB_00113054;
      pcVar55 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var14._M_i + 0x40))->
                        seqtree;
      _Var15._M_i = (__int_type)(pfVar21->field_6).seqtree;
      iVar11 = bcmp(pcVar55,(void *)_Var15._M_i,
                    (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var14._M_i + 0x10));
      if (iVar11 != 0) goto LAB_00113049;
      fdb_doc_free((fdb_doc *)_Var14._M_i);
      _Stack_788._M_i = 0;
      pcVar59 = &((fdb_kvs_config *)&((filemgr *)pcVar59)->filename)->field_0x1;
      fVar10 = fdb_iterator_next((fdb_iterator *)auStack_798._8_8_);
      _Var20._M_i = _Var14._M_i;
    } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
    puVar9 = auStack_c28;
    if ((uint8_t *)pcVar59 != (uint8_t *)0xa) goto LAB_0011314f;
    pfVar21 = (fdb_kvs_handle *)(auStack_798 + 8);
    fdb_iterator_close((fdb_iterator *)auStack_798._8_8_);
    _Var14._M_i = (__int_type)&abStack_b28[4].alc_list.tail;
    sprintf((char *)_Var14._M_i,"key%d",4);
    _Var15._M_i = (__int_type)abStack_b28;
    sprintf((char *)_Var15._M_i,"key%d",8);
    pcVar55 = (char *)auStack_798._0_8_;
    pcVar59 = (char *)strlen((char *)_Var14._M_i);
    sVar12 = strlen((char *)_Var15._M_i);
    uStack_c40 = 0x112ac8;
    fVar10 = fdb_iterator_init((fdb_kvs_handle *)pcVar55,(fdb_iterator **)pfVar21,
                               (void *)_Var14._M_i,(size_t)pcVar59,(void *)_Var15._M_i,sVar12,2);
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00113154;
    fVar10 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_798._8_8_);
    puVar9 = auStack_c28;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00113159;
    fVar10 = fdb_iterator_get((fdb_iterator *)auStack_798._8_8_,(fdb_doc **)&_Stack_788);
    _Var23._M_i = _Stack_788._M_i;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011315e;
    _Var14._M_i = *(__int_type *)(_Stack_788._M_i + 0x20);
    pcVar55 = (char *)(pbStack_7b8->alc_list).tail;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,*(size_t *)_Stack_788._M_i);
    puVar9 = auStack_c28;
    _Var15._M_i = (__int_type)pbStack_7b8;
    if (iVar11 != 0) goto LAB_00113163;
    _Var14._M_i = *(__int_type *)(_Var23._M_i + 0x38);
    pcVar55 = (char *)pbStack_7b8->file;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,(size_t)*(fdb_custom_cmp_variable *)(_Var23._M_i + 8))
    ;
    if (iVar11 != 0) goto LAB_0011316e;
    _Var14._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var23._M_i + 0x40))->seqtree;
    pcVar55 = (char *)pbStack_7b8->log_callback;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,
                  (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var23._M_i + 0x10));
    puVar9 = auStack_c28;
    if (iVar11 != 0) goto LAB_00113179;
    fdb_doc_free((fdb_doc *)_Var23._M_i);
    _Stack_788._M_i = 0;
    fVar10 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_798._8_8_);
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00113184;
    fVar10 = fdb_iterator_get((fdb_iterator *)auStack_798._8_8_,(fdb_doc **)&_Stack_788);
    _Var20._M_i = _Stack_788._M_i;
    puVar9 = auStack_c28;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00113189;
    _Var14._M_i = *(__int_type *)(_Stack_788._M_i + 0x20);
    pcVar55 = (char *)(apbStack_7f0[3]->alc_list).tail;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,*(size_t *)_Stack_788._M_i);
    _Var15._M_i = (__int_type)apbStack_7f0[3];
    if (iVar11 != 0) goto LAB_0011318e;
    _Var14._M_i = *(__int_type *)(_Var20._M_i + 0x38);
    pcVar55 = (char *)apbStack_7f0[3]->file;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,(size_t)*(fdb_custom_cmp_variable *)(_Var20._M_i + 8))
    ;
    puVar9 = auStack_c28;
    if (iVar11 != 0) goto LAB_00113199;
    _Var14._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var20._M_i + 0x40))->seqtree;
    pcVar55 = (char *)apbStack_7f0[3]->log_callback;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,
                  (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var20._M_i + 0x10));
    if (iVar11 != 0) goto LAB_001131a4;
    fdb_doc_free((fdb_doc *)_Var20._M_i);
    _Stack_788._M_i = 0;
    fVar10 = fdb_iterator_close((fdb_iterator *)auStack_798._8_8_);
    puVar9 = auStack_c28;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001131af;
    uStack_c40 = 0x112c3c;
    fVar10 = fdb_iterator_init((fdb_kvs_handle *)auStack_798._0_8_,
                               (fdb_iterator **)(auStack_798 + 8),(void *)0x0,0,(void *)0x0,0,0);
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001131b4;
    fVar10 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_798._8_8_);
    puVar9 = auStack_c28;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001131b9;
    fVar10 = fdb_iterator_get((fdb_iterator *)auStack_798._8_8_,(fdb_doc **)&_Stack_788);
    _Var15._M_i = _Stack_788._M_i;
    doc_02 = (char *)pbStack_7b0;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001131be;
    _Var14._M_i = *(__int_type *)(_Stack_788._M_i + 0x20);
    pcVar55 = (char *)(pbStack_7b0->alc_list).tail;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,*(size_t *)_Stack_788._M_i);
    puVar9 = auStack_c28;
    if (iVar11 != 0) goto LAB_001131c3;
    _Var14._M_i = *(__int_type *)(_Var15._M_i + 0x38);
    pcVar55 = (char *)((btreeblk_handle *)doc_02)->file;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,(size_t)*(fdb_custom_cmp_variable *)(_Var15._M_i + 8))
    ;
    if (iVar11 != 0) goto LAB_001131ce;
    _Var14._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var15._M_i + 0x40))->seqtree;
    pcVar55 = (char *)((btreeblk_handle *)doc_02)->log_callback;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,
                  (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var15._M_i + 0x10));
    puVar9 = auStack_c28;
    if (iVar11 != 0) goto LAB_001131d9;
    fdb_doc_free((fdb_doc *)_Var15._M_i);
    _Stack_788._M_i = 0;
    fVar10 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_798._8_8_);
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001131e4;
    fVar10 = fdb_iterator_get((fdb_iterator *)auStack_798._8_8_,(fdb_doc **)&_Stack_788);
    _Var23._M_i = _Stack_788._M_i;
    puVar9 = auStack_c28;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001131e9;
    _Var14._M_i = *(__int_type *)(_Stack_788._M_i + 0x20);
    pcVar55 = (char *)((list *)(auStack_810._24_8_ + 0x18))->tail;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,*(size_t *)_Stack_788._M_i);
    doc_02 = (char *)auStack_810._24_8_;
    if (iVar11 != 0) goto LAB_001131ee;
    _Var14._M_i = *(__int_type *)(_Var23._M_i + 0x38);
    pcVar55 = *(char **)(auStack_810._24_8_ + 0x38);
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,(size_t)*(fdb_custom_cmp_variable *)(_Var23._M_i + 8))
    ;
    puVar9 = auStack_c28;
    if (iVar11 != 0) goto LAB_001131f9;
    _Var14._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var23._M_i + 0x40))->seqtree;
    pcVar55 = *(char **)(auStack_810._24_8_ + 0x40);
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,
                  (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var23._M_i + 0x10));
    if (iVar11 != 0) goto LAB_00113204;
    fdb_doc_free((fdb_doc *)_Var23._M_i);
    _Stack_788._M_i = 0;
    _Var23._M_i = (__int_type)afStack_10ba8;
    memset((void *)_Var23._M_i,0xff,0xff80);
    fVar10 = fdb_iterator_seek((fdb_iterator *)auStack_798._8_8_,(void *)_Var23._M_i,0xff80,'\x01');
    pfVar52 = (fdb_kvs_handle *)_Var23._M_i;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011320f;
    fVar10 = fdb_iterator_get((fdb_iterator *)auStack_798._8_8_,(fdb_doc **)&_Stack_788);
    _Var15._M_i = _Stack_788._M_i;
    pfVar21 = (fdb_kvs_handle *)_Var23._M_i;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00113214;
    _Var14._M_i = *(__int_type *)(_Stack_788._M_i + 0x20);
    pcVar55 = (char *)(pbStack_7b0->alc_list).tail;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,*(size_t *)_Stack_788._M_i);
    doc_02 = (char *)pbStack_7b0;
    if (iVar11 != 0) goto LAB_00113219;
    _Var14._M_i = *(__int_type *)(_Var15._M_i + 0x38);
    pcVar55 = (char *)pbStack_7b0->file;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,(size_t)*(fdb_custom_cmp_variable *)(_Var15._M_i + 8))
    ;
    if (iVar11 != 0) goto LAB_00113224;
    _Var14._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var15._M_i + 0x40))->seqtree;
    pcVar55 = (char *)pbStack_7b0->log_callback;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,
                  (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var15._M_i + 0x10));
    if (iVar11 != 0) goto LAB_0011322f;
    fdb_doc_free((fdb_doc *)_Var15._M_i);
    _Stack_788._M_i = 0;
    fVar10 = fdb_iterator_close((fdb_iterator *)auStack_798._8_8_);
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011323a;
    pfVar21 = (fdb_kvs_handle *)0xfffffffffffffffe;
    do {
      fVar10 = fdb_del((fdb_kvs_handle *)auStack_798._0_8_,
                       (fdb_doc *)apbStack_7f0[(long)&(pfVar21->kvs_config).field_0x1]);
      _Var15._M_i = (__int_type)pbStack_7b0;
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011305f;
      pfVar21 = (fdb_kvs_handle *)&(pfVar21->kvs_config).field_0x2;
    } while (pfVar21 < (undefined1 *)0x8);
    fdb_commit((fdb_file_handle *)auStack_7a0,'\0');
    fdb_iterator_init((fdb_kvs_handle *)auStack_798._0_8_,(fdb_iterator **)(auStack_798 + 8),
                      (void *)0x0,0,(void *)0x0,0,0);
    _Var15._M_i = auStack_798._8_8_;
    _Stack_788._M_i = 0;
    _Var14._M_i = (__int_type)(apbStack_7f0[1]->alc_list).tail;
    sVar12 = strlen((char *)&abStack_b28[4].alc_list.tail);
    fVar10 = fdb_iterator_seek((fdb_iterator *)_Var15._M_i,(void *)_Var14._M_i,sVar12,'\0');
    if (fVar10 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011323f;
    fVar10 = fdb_iterator_get((fdb_iterator *)auStack_798._8_8_,(fdb_doc **)&_Stack_788);
    _Var20._M_i = _Stack_788._M_i;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00113244;
    _Var14._M_i = *(__int_type *)(_Stack_788._M_i + 0x20);
    pcVar55 = (char *)(apbStack_7f0[1]->alc_list).tail;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,*(size_t *)_Stack_788._M_i);
    doc_02 = (char *)apbStack_7f0[1];
    if (iVar11 != 0) goto LAB_00113249;
    _Var14._M_i = *(__int_type *)(_Var20._M_i + 0x38);
    pcVar55 = (char *)apbStack_7f0[1]->file;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,(size_t)*(fdb_custom_cmp_variable *)(_Var20._M_i + 8))
    ;
    if (iVar11 != 0) goto LAB_00113254;
    _Var14._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var20._M_i + 0x40))->seqtree;
    pcVar55 = (char *)apbStack_7f0[1]->log_callback;
    pfVar56 = (filemgr *)pcVar55;
    iVar11 = bcmp((void *)_Var14._M_i,pcVar55,
                  (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(_Var20._M_i + 0x10));
    uVar65 = SUB84(pfVar56,0);
    if (iVar11 != 0) goto LAB_0011325f;
    fdb_doc_free((fdb_doc *)_Var20._M_i);
    _Stack_788._M_i = 0;
    fVar10 = fdb_iterator_close((fdb_iterator *)auStack_798._8_8_);
    uVar17 = (uint)auStack_798._8_8_;
    if (fVar10 == FDB_RESULT_SUCCESS) {
      fdb_kvs_close((fdb_kvs_handle *)_Stack_7a8._M_i);
      fdb_kvs_close((fdb_kvs_handle *)auStack_798._0_8_);
      fdb_close((fdb_file_handle *)auStack_7a0);
      lVar19 = 0;
      do {
        fdb_doc_free((fdb_doc *)apbStack_7f0[lVar19 + -1]);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 10);
      fdb_shutdown();
      memleak_end();
      pcVar55 = "%s PASSED\n";
      if (iterator_seek_test()::__test_pass != '\0') {
        pcVar55 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar55,"iterator seek test");
      return;
    }
  }
  else {
LAB_00113064:
    *(undefined8 *)((long)pfVar26 + -8) = 0x113069;
    iterator_seek_test();
    puVar9 = (undefined1 *)pfVar26;
LAB_00113069:
    puVar27 = puVar9;
    *(undefined8 *)(puVar27 + -8) = 0x11306e;
    iterator_seek_test();
LAB_0011306e:
    pbVar57 = (btreeblk_handle *)_Var15._M_i;
    _Var20._M_i = (__int_type)pfVar21;
    *(undefined8 *)(puVar27 + -8) = 0x113073;
    iterator_seek_test();
    puVar9 = puVar27;
LAB_00113073:
    puVar28 = puVar9;
    *(undefined8 *)(puVar28 + -8) = 0x11307e;
    iterator_seek_test();
LAB_0011307e:
    *(undefined8 *)(puVar28 + -8) = 0x113089;
    iterator_seek_test();
    puVar9 = puVar28;
LAB_00113089:
    puVar29 = puVar9;
    *(undefined8 *)(puVar29 + -8) = 0x113094;
    iterator_seek_test();
LAB_00113094:
    *(undefined8 *)(puVar29 + -8) = 0x113099;
    iterator_seek_test();
    puVar9 = puVar29;
LAB_00113099:
    pbVar25 = pbVar57;
    puVar30 = puVar9;
    _Var15._M_i = _Var20._M_i;
    *(undefined8 *)(puVar30 + -8) = 0x11309e;
    iterator_seek_test();
LAB_0011309e:
    *(undefined8 *)(puVar30 + -8) = 0x1130a9;
    iterator_seek_test();
    puVar9 = puVar30;
LAB_001130a9:
    puVar31 = puVar9;
    *(undefined8 *)(puVar31 + -8) = 0x1130b4;
    iterator_seek_test();
LAB_001130b4:
    *(undefined8 *)(puVar31 + -8) = 0x1130bf;
    iterator_seek_test();
    puVar9 = puVar31;
LAB_001130bf:
    puVar32 = puVar9;
    *(undefined8 *)(puVar32 + -8) = 0x1130c4;
    iterator_seek_test();
LAB_001130c4:
    pbVar57 = pbVar25;
    _Var20._M_i = _Var15._M_i;
    *(undefined8 *)(puVar32 + -8) = 0x1130c9;
    iterator_seek_test();
    puVar9 = puVar32;
LAB_001130c9:
    puVar33 = puVar9;
    *(undefined8 *)(puVar33 + -8) = 0x1130d4;
    iterator_seek_test();
LAB_001130d4:
    *(undefined8 *)(puVar33 + -8) = 0x1130df;
    iterator_seek_test();
    puVar9 = puVar33;
LAB_001130df:
    puVar34 = puVar9;
    *(undefined8 *)(puVar34 + -8) = 0x1130ea;
    iterator_seek_test();
LAB_001130ea:
    *(undefined8 *)(puVar34 + -8) = 0x1130ef;
    iterator_seek_test();
    puVar9 = puVar34;
LAB_001130ef:
    pbVar25 = pbVar57;
    puVar35 = puVar9;
    _Var22._M_i = _Var20._M_i;
    *(undefined8 *)(puVar35 + -8) = 0x1130f4;
    iterator_seek_test();
LAB_001130f4:
    *(undefined8 *)(puVar35 + -8) = 0x1130ff;
    iterator_seek_test();
    puVar9 = puVar35;
LAB_001130ff:
    puVar36 = puVar9;
    *(undefined8 *)(puVar36 + -8) = 0x11310a;
    iterator_seek_test();
LAB_0011310a:
    *(undefined8 *)(puVar36 + -8) = 0x113115;
    iterator_seek_test();
    puVar9 = puVar36;
LAB_00113115:
    puVar37 = puVar9;
    *(undefined8 *)(puVar37 + -8) = 0x11311a;
    iterator_seek_test();
LAB_0011311a:
    _Var15._M_i = (__int_type)pbVar25;
    _Var20._M_i = _Var22._M_i;
    *(undefined8 *)(puVar37 + -8) = 0x11311f;
    iterator_seek_test();
    puVar9 = puVar37;
LAB_0011311f:
    puVar38 = puVar9;
    *(undefined8 *)(puVar38 + -8) = 0x11312a;
    iterator_seek_test();
LAB_0011312a:
    *(undefined8 *)(puVar38 + -8) = 0x113135;
    iterator_seek_test();
    puVar9 = puVar38;
LAB_00113135:
    puVar39 = puVar9;
    *(undefined8 *)(puVar39 + -8) = 0x113140;
    iterator_seek_test();
LAB_00113140:
    *(undefined8 *)(puVar39 + -8) = 0x113145;
    iterator_seek_test();
    puVar9 = puVar39;
LAB_00113145:
    puVar40 = puVar9;
    pfVar21 = (fdb_kvs_handle *)_Var20._M_i;
    *(undefined8 *)(puVar40 + -8) = 0x11314a;
    iterator_seek_test();
LAB_0011314a:
    *(undefined8 *)(puVar40 + -8) = 0x11314f;
    iterator_seek_test();
    puVar9 = puVar40;
LAB_0011314f:
    puVar41 = puVar9;
    *(undefined8 *)(puVar41 + -8) = 0x113154;
    iterator_seek_test();
LAB_00113154:
    *(undefined8 *)(puVar41 + -8) = 0x113159;
    iterator_seek_test();
    puVar9 = puVar41;
LAB_00113159:
    puVar42 = puVar9;
    *(undefined8 *)(puVar42 + -8) = 0x11315e;
    iterator_seek_test();
LAB_0011315e:
    _Var23._M_i = (__int_type)pfVar21;
    *(undefined8 *)(puVar42 + -8) = 0x113163;
    iterator_seek_test();
    puVar9 = puVar42;
LAB_00113163:
    puVar43 = puVar9;
    *(undefined8 *)(puVar43 + -8) = 0x11316e;
    iterator_seek_test();
LAB_0011316e:
    *(undefined8 *)(puVar43 + -8) = 0x113179;
    iterator_seek_test();
    puVar9 = puVar43;
LAB_00113179:
    puVar44 = puVar9;
    *(undefined8 *)(puVar44 + -8) = 0x113184;
    iterator_seek_test();
LAB_00113184:
    *(undefined8 *)(puVar44 + -8) = 0x113189;
    iterator_seek_test();
    puVar9 = puVar44;
LAB_00113189:
    puVar45 = puVar9;
    _Var20._M_i = _Var23._M_i;
    *(undefined8 *)(puVar45 + -8) = 0x11318e;
    iterator_seek_test();
LAB_0011318e:
    *(undefined8 *)(puVar45 + -8) = 0x113199;
    iterator_seek_test();
    puVar9 = puVar45;
LAB_00113199:
    puVar46 = puVar9;
    *(undefined8 *)(puVar46 + -8) = 0x1131a4;
    iterator_seek_test();
LAB_001131a4:
    *(undefined8 *)(puVar46 + -8) = 0x1131af;
    iterator_seek_test();
    puVar9 = puVar46;
LAB_001131af:
    puVar47 = puVar9;
    *(undefined8 *)(puVar47 + -8) = 0x1131b4;
    iterator_seek_test();
LAB_001131b4:
    *(undefined8 *)(puVar47 + -8) = 0x1131b9;
    iterator_seek_test();
    puVar9 = puVar47;
LAB_001131b9:
    puVar48 = puVar9;
    *(undefined8 *)(puVar48 + -8) = 0x1131be;
    iterator_seek_test();
    apbStack_7f0[3] = (btreeblk_handle *)_Var15._M_i;
LAB_001131be:
    doc_02 = (char *)apbStack_7f0[3];
    _Var15._M_i = _Var20._M_i;
    *(undefined8 *)(puVar48 + -8) = 0x1131c3;
    iterator_seek_test();
    puVar9 = puVar48;
LAB_001131c3:
    puVar49 = puVar9;
    *(undefined8 *)(puVar49 + -8) = 0x1131ce;
    iterator_seek_test();
LAB_001131ce:
    *(undefined8 *)(puVar49 + -8) = 0x1131d9;
    iterator_seek_test();
    puVar9 = puVar49;
LAB_001131d9:
    puVar50 = puVar9;
    *(undefined8 *)(puVar50 + -8) = 0x1131e4;
    iterator_seek_test();
LAB_001131e4:
    *(undefined8 *)(puVar50 + -8) = 0x1131e9;
    iterator_seek_test();
    puVar9 = puVar50;
LAB_001131e9:
    puVar51 = puVar9;
    _Var23._M_i = _Var15._M_i;
    *(undefined8 *)(puVar51 + -8) = 0x1131ee;
    iterator_seek_test();
LAB_001131ee:
    *(undefined8 *)(puVar51 + -8) = 0x1131f9;
    iterator_seek_test();
    puVar9 = puVar51;
LAB_001131f9:
    pfVar52 = (fdb_kvs_handle *)puVar9;
    *(undefined8 *)((long)pfVar52 + -8) = 0x113204;
    iterator_seek_test();
LAB_00113204:
    *(undefined8 *)((long)pfVar52 + -8) = 0x11320f;
    iterator_seek_test();
LAB_0011320f:
    pfVar52[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113214;
    iterator_seek_test();
    pfVar21 = (fdb_kvs_handle *)_Var23._M_i;
    _Var23._M_i = (__int_type)pfVar52;
LAB_00113214:
    _Var15._M_i = (__int_type)pfVar21;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113219;
    iterator_seek_test();
LAB_00113219:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113224;
    iterator_seek_test();
LAB_00113224:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11322f;
    iterator_seek_test();
LAB_0011322f:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11323a;
    iterator_seek_test();
LAB_0011323a:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11323f;
    iterator_seek_test();
LAB_0011323f:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113244;
    iterator_seek_test();
LAB_00113244:
    _Var20._M_i = _Var15._M_i;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113249;
    iterator_seek_test();
LAB_00113249:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113254;
    iterator_seek_test();
LAB_00113254:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11325f;
    iterator_seek_test();
LAB_0011325f:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11326a;
    pfVar21 = (fdb_kvs_handle *)_Var14._M_i;
    pfVar56 = (filemgr *)pcVar55;
    iterator_seek_test();
    uVar17 = (uint)pfVar56;
    uVar65 = SUB84(pfVar21,0);
  }
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle =
       (fdb_kvs_handle *)iterator_complete_test;
  iterator_seek_test();
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)&aStack_758;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).space_used = (uint64_t)pcVar55;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).num_entries = _Var14._M_i;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x208))->bub_ctx).entries = (list *)pcVar59;
  *(char **)&((fdb_kvs_handle *)(_Var23._M_i + -0x208))->num_iterators = doc_02;
  ((fdb_kvs_handle *)(_Var23._M_i + -0x208))->node = (kvs_opened_node *)_Var20._M_i;
  *(undefined4 *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
       = uVar65;
  pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113296;
  gettimeofday((timeval *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x208))->config).compaction_cb_mask,
               (__timezone_ptr_t)0x0);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
  ((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node = (kvs_opened_node *)0x202066722d206d72;
  *(undefined8 *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->num_iterators = 0x726f746172657469;
  *(undefined8 *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->field_0x1e7 = 0x2a747365745f72;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1132c4;
  system((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1132c9;
  memleak_start();
  fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x208))->config).max_writer_lock_prob;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1132d9;
  fdb_get_default_config();
  *(undefined4 *)
   ((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x208))->config).num_bgflusher_threads + 4) = 1;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1132ed;
  fdb_get_default_kvs_config();
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113301;
  fVar10 = fdb_open((fdb_file_handle **)
                    ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4),
                    "./iterator_test",(fdb_config *)fconfig);
  if (fVar10 != FDB_RESULT_SUCCESS) {
LAB_001150b7:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150bc;
    iterator_complete_test();
LAB_001150bc:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150c1;
    iterator_complete_test();
LAB_001150c1:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150c6;
    iterator_complete_test();
LAB_001150c6:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150cb;
    iterator_complete_test();
LAB_001150cb:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150d0;
    iterator_complete_test();
LAB_001150d0:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150d5;
    iterator_complete_test();
LAB_001150d5:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150da;
    iterator_complete_test();
LAB_001150da:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150df;
    iterator_complete_test();
LAB_001150df:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150e4;
    iterator_complete_test();
LAB_001150e4:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150e9;
    iterator_complete_test();
LAB_001150e9:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150ee;
    iterator_complete_test();
LAB_001150ee:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150f3;
    iterator_complete_test();
LAB_001150f3:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150f8;
    iterator_complete_test();
LAB_001150f8:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150fd;
    iterator_complete_test();
LAB_001150fd:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115102;
    iterator_complete_test();
LAB_00115102:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115107;
    iterator_complete_test();
LAB_00115107:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11510c;
    iterator_complete_test();
LAB_0011510c:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115111;
    iterator_complete_test();
LAB_00115111:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115121;
    iterator_complete_test();
LAB_00115121:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115126;
    iterator_complete_test();
LAB_00115126:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11512b;
    iterator_complete_test();
LAB_0011512b:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115130;
    iterator_complete_test();
LAB_00115130:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115135;
    iterator_complete_test();
LAB_00115135:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115145;
    iterator_complete_test();
LAB_00115145:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11514a;
    iterator_complete_test();
LAB_0011514a:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11514f;
    iterator_complete_test();
LAB_0011514f:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115154;
    iterator_complete_test();
    pfVar56 = (filemgr *)pcVar59;
LAB_00115154:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115159;
    iterator_complete_test();
LAB_00115159:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11515e;
    iterator_complete_test();
LAB_0011515e:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115163;
    iterator_complete_test();
LAB_00115163:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115168;
    iterator_complete_test();
LAB_00115168:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11516d;
    iterator_complete_test();
LAB_0011516d:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115172;
    iterator_complete_test();
LAB_00115172:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115177;
    iterator_complete_test();
    pfVar52 = pfVar21;
LAB_00115177:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11517c;
    iterator_complete_test();
LAB_0011517c:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115181;
    iterator_complete_test();
    pfVar21 = pfVar52;
LAB_00115181:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115186;
    iterator_complete_test();
LAB_00115186:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11518b;
    iterator_complete_test();
LAB_0011518b:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115190;
    iterator_complete_test();
LAB_00115190:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115195;
    iterator_complete_test();
LAB_00115195:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11519a;
    iterator_complete_test();
LAB_0011519a:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11519f;
    iterator_complete_test();
LAB_0011519f:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151a4;
    iterator_complete_test();
LAB_001151a4:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
         iterator_extreme_key_test;
    iterator_complete_test();
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = pcVar55;
    *(fdb_kvs_handle **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_mask =
         pfVar21;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb =
         (fdb_compaction_callback)pfVar56;
    *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_wal_partitions = doc_02;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).prefetch_duration = (uint64_t)fconfig;
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1151c5;
    gettimeofday((timeval *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).num_wal_partitions
                 ,(__timezone_ptr_t)0x0);
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt = '\0';
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).durability_opt = '\0';
    *(undefined2 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).field_0x22 = 0;
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).flags = 0;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x820))->filename = (char *)0x202066722d206d72;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x820))->txn = (fdb_txn *)0x726f746172657469;
    *(undefined8 *)((long)&((fdb_kvs_handle *)(_Var23._M_i + -0x820))->txn + 7) = 0x2a747365745f72;
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1151f3;
    system((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x820))->filename);
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1151f8;
    memleak_start();
    fconfig_00 = (atomic<unsigned_char> *)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xa28))->config).compaction_cb_mask;
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115208;
    fdb_get_default_config();
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115212;
    fdb_get_default_kvs_config();
    pfVar52 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_minimum_filesize;
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115226;
    fVar10 = fdb_open((fdb_file_handle **)pfVar52,"./iterator_test",(fdb_config *)fconfig_00);
    if (fVar10 == FDB_RESULT_SUCCESS) {
      pfVar52 = (fdb_kvs_handle *)
                (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_minimum_filesize;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115244;
      fVar10 = fdb_kvs_open((fdb_file_handle *)pfVar52,
                            (fdb_kvs_handle **)
                            &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                             compaction_buf_maxsize,(char *)0x0,
                            (fdb_kvs_config *)
                            &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                             compactor_sleep_duration);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115640;
      fconfig_00 = &((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->handle_busy;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115266;
      memset(fconfig_00,0xff,0x100);
      uVar58 = 1;
      pcVar55 = "0xff length %d";
      doc_02 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_cb_mask;
      do {
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115288;
        sprintf(doc_02,"0xff length %d",uVar58 & 0xffffffff);
        pfVar56 = *(filemgr **)
                   &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_buf_maxsize;
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115295;
        sVar12 = strlen(doc_02);
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1152aa;
        fdb_set_kv((fdb_kvs_handle *)pfVar56,fconfig_00,uVar58,doc_02,sVar12 + 1);
        uVar58 = uVar58 + 1;
      } while (uVar58 != 0x1e);
      pfVar18 = (fdb_file_handle *)
                (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_minimum_filesize;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1152c2;
      fdb_commit(pfVar18,'\x01');
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_threshold = 0;
      pfVar52 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1152e0;
      fVar10 = fdb_doc_create((fdb_doc **)pfVar52,(void *)0x0,0,(void *)0x0,0,(void *)0x0,
                              (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_threshold);
      pfVar21 = (fdb_kvs_handle *)0x1e;
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115645;
      lVar19 = *(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt;
      *(uint16_t **)(lVar19 + 0x20) =
           &(((fdb_kvs_handle *)(_Var23._M_i + -0x820))->config).num_wal_partitions;
      *(undefined8 *)(lVar19 + 0x38) = 0;
      *(fdb_txn ***)(lVar19 + 0x40) = &((fdb_kvs_handle *)(_Var23._M_i + -0xa28))->txn;
      pfVar52 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_buf_maxsize;
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_threshold = 0;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11532d;
      fVar10 = fdb_iterator_init(pfVar52,(fdb_iterator **)
                                         &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                                          wal_flush_before_commit,(void *)0x0,0,(void *)0x0,0,
                                 (fdb_iterator_opt_t)
                                 (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_threshold)
      ;
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011564a;
      pfVar52 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11533f;
      fVar10 = fdb_iterator_seek_to_max((fdb_iterator *)pfVar52);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011564f;
      fconfig_00 = (atomic<unsigned_char> *)0x1d;
      do {
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11536a;
        fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                         &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                                          seqtree_opt);
        if (fVar10 != FDB_RESULT_SUCCESS) break;
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11537d;
        sprintf((char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_cb_mask,
                "0xff length %d",fconfig_00);
        sVar12 = *(size_t *)
                  (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt + 0x10
                  );
        pfVar56 = *(filemgr **)
                   (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt +
                   0x40);
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115395;
        iVar11 = bcmp(pfVar56,&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                               compaction_cb_mask,sVar12);
        if (iVar11 != 0) {
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115614;
          iterator_extreme_key_test();
          goto LAB_00115614;
        }
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1153a7;
        fVar10 = fdb_iterator_prev(pfVar3);
        fconfig_00 = (atomic<unsigned_char> *)(ulong)((int)fconfig_00 - 1);
      } while (fVar10 == FDB_RESULT_SUCCESS);
      pfVar3 = *(fdb_iterator **)
                &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1153c9;
      fVar10 = fdb_iterator_seek(pfVar3,&((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->handle_busy,8,
                                 '\x01');
      if (fVar10 == FDB_RESULT_SUCCESS) {
        fconfig_00 = (atomic<unsigned_char> *)0x8;
        do {
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1153f0;
          fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                           &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                                            seqtree_opt);
          if (fVar10 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115403;
          sprintf((char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_cb_mask,
                  "0xff length %d",fconfig_00);
          sVar12 = *(size_t *)
                    (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt +
                    0x10);
          pfVar56 = *(filemgr **)
                     (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt +
                     0x40);
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11541b;
          iVar11 = bcmp(pfVar56,&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                                 compaction_cb_mask,sVar12);
          if (iVar11 != 0) goto LAB_00115621;
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11542d;
          fVar10 = fdb_iterator_prev(pfVar3);
          fconfig_00 = (atomic<unsigned_char> *)(ulong)((int)fconfig_00 - 1);
        } while (fVar10 == FDB_RESULT_SUCCESS);
      }
      pfVar3 = *(fdb_iterator **)
                &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11544f;
      fVar10 = fdb_iterator_seek(pfVar3,&((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->handle_busy,8,
                                 '\x01');
      if (fVar10 == FDB_RESULT_SUCCESS) {
        fconfig_00 = (atomic<unsigned_char> *)0x8;
        do {
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115476;
          fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                           &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                                            seqtree_opt);
          if (fVar10 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115489;
          sprintf((char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_cb_mask,
                  "0xff length %d",fconfig_00);
          sVar12 = *(size_t *)
                    (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt +
                    0x10);
          pfVar56 = *(filemgr **)
                     (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt +
                     0x40);
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1154a1;
          iVar11 = bcmp(pfVar56,&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                                 compaction_cb_mask,sVar12);
          if (iVar11 != 0) goto LAB_0011562e;
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1154b3;
          fVar10 = fdb_iterator_next(pfVar3);
          fconfig_00 = (atomic<unsigned_char> *)(ulong)((int)fconfig_00 + 1);
        } while (fVar10 == FDB_RESULT_SUCCESS);
      }
      pfVar21 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt;
      doc_02 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_cb_mask;
      pcVar55 = "0xff length %d";
      pfVar52 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1154c3;
      fVar10 = fdb_iterator_close((fdb_iterator *)pfVar52);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115654;
      pfVar52 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_buf_maxsize;
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_threshold = 0;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1154f3;
      fVar10 = fdb_iterator_init(pfVar52,(fdb_iterator **)
                                         &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).
                                          wal_flush_before_commit,(void *)0x0,0,
                                 &((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->handle_busy,0x100,
                                 (fdb_iterator_opt_t)
                                 (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_threshold)
      ;
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115659;
      pfVar52 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115505;
      fVar10 = fdb_iterator_seek_to_max((fdb_iterator *)pfVar52);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011565e;
      fconfig_00 = (atomic<unsigned_char> *)0x1d;
      pfVar21 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt;
      pcVar55 = "0xff length %d";
      doc_02 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_cb_mask;
      do {
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115530;
        fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)pfVar21);
        if (fVar10 != FDB_RESULT_SUCCESS) break;
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115543;
        sprintf(doc_02,"0xff length %d",fconfig_00);
        sVar12 = *(size_t *)
                  (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt + 0x10
                  );
        pfVar56 = *(filemgr **)
                   (*(long *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt +
                   0x40);
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11555b;
        iVar11 = bcmp(pfVar56,doc_02,sVar12);
        if (iVar11 != 0) goto LAB_00115614;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11556d;
        fVar10 = fdb_iterator_prev(pfVar3);
        fconfig_00 = (atomic<unsigned_char> *)(ulong)((int)fconfig_00 - 1);
      } while (fVar10 == FDB_RESULT_SUCCESS);
      pfVar52 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11557d;
      fVar10 = fdb_iterator_close((fdb_iterator *)pfVar52);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115663;
      pfVar52 = (fdb_kvs_handle *)
                (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).compaction_minimum_filesize;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11558f;
      fVar10 = fdb_close((fdb_file_handle *)pfVar52);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115668;
      pfVar52 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).seqtree_opt;
      pfVar52->op_stats = (kvs_ops_stat *)0x0;
      (pfVar52->field_6).seqtree = (btree *)0x0;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1155ab;
      fVar10 = fdb_doc_free((fdb_doc *)pfVar52);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011566d;
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1155b8;
      fVar10 = fdb_shutdown();
      if (fVar10 == FDB_RESULT_SUCCESS) {
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1155c5;
        memleak_end();
        pcVar55 = "%s PASSED\n";
        if (iterator_extreme_key_test()::__test_pass != '\0') {
          pcVar55 = "%s FAILED\n";
        }
        (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x1155f6;
        fprintf(_stderr,pcVar55,"iterator extreme key test");
        return;
      }
    }
    else {
LAB_0011563b:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115640;
      iterator_extreme_key_test();
LAB_00115640:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115645;
      iterator_extreme_key_test();
LAB_00115645:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11564a;
      iterator_extreme_key_test();
LAB_0011564a:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11564f;
      iterator_extreme_key_test();
LAB_0011564f:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115654;
      iterator_extreme_key_test();
LAB_00115654:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115659;
      iterator_extreme_key_test();
LAB_00115659:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11565e;
      iterator_extreme_key_test();
LAB_0011565e:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115663;
      iterator_extreme_key_test();
LAB_00115663:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115668;
      iterator_extreme_key_test();
LAB_00115668:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x11566d;
      iterator_extreme_key_test();
LAB_0011566d:
      (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = 0x115672;
      iterator_extreme_key_test();
    }
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size =
         (uint64_t)iterator_inmem_snapshot_seek_test;
    iterator_extreme_key_test();
    (((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config).buffercache_size = (uint64_t)pcVar54;
    *(char **)&((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->config = pcVar55;
    ((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->fileops = (filemgr_ops *)pfVar21;
    ((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->btreeblkops = (btree_blk_ops *)pfVar56;
    ((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->bhandle = (btreeblk_handle *)doc_02;
    ((fdb_kvs_handle *)(_Var23._M_i + -0xc30))->dhandle = (docio_handle *)fconfig_00;
    sVar12 = (ulong)pfVar52 & 0xffffffff;
    pvVar62 = (void *)0x0;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x11569c;
    gettimeofday((timeval *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->bhandle,
                 (__timezone_ptr_t)0x0);
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1156a1;
    memleak_start();
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).num_entries = 0;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1156b2;
    system("rm -rf  iterator_test* > errorlog.txt");
    pfVar24 = (fdb_doc *)&(((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->config).num_blocks_readahead;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1156c2;
    fdb_get_default_config();
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1156cc;
    fdb_get_default_kvs_config();
    (((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->log_callback).callback = (fdb_log_callback)0x0;
    (((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->log_callback).callback_ex =
         (fdb_log_callback_ex)0x400;
    *(undefined4 *)
     ((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->cur_header_revnum).
             super___atomic_base<unsigned_long>._M_i + 4) = 1;
    *(undefined1 *)((long)&((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->rollback_revnum + 7) = 0;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1156f7;
    fVar10 = fdb_open((fdb_file_handle **)(_Var23._M_i + -0x1040),"./iterator_test1",
                      (fdb_config *)pfVar24);
    if (fVar10 == FDB_RESULT_SUCCESS) {
      *(int *)((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->kvs_config).custom_cmp + 4) =
           (int)pfVar52;
      pfVar21 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->kvs_config;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115717;
      fVar10 = fdb_kvs_open_default
                         ((fdb_file_handle *)pfVar21,
                          &(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).handle,
                          (fdb_kvs_config *)
                          &(((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->kvs_config).
                           custom_cmp_param);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115b0c;
      pfVar56 = (filemgr *)0x0;
      uVar58 = 0;
      do {
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115742;
        sprintf((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->btreeblkops,"%c2",
                (ulong)((int)uVar58 + 0x61));
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x11575b;
        sprintf((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->log_callback,"meta%d",
                uVar58 & 0xffffffff);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115774;
        sprintf((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->fileops,"body%d",
                uVar58 & 0xffffffff);
        doc_02 = (char *)(_Var23._M_i + (long)pfVar56 + -0x1018);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115784;
        sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->btreeblkops);
        pfVar24 = (fdb_doc *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->log_callback;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115797;
        pcVar55 = (char *)strlen((char *)pfVar24);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1157a7;
        sVar13 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->fileops);
        *(size_t *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators = sVar13;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1157cc;
        fdb_doc_create((fdb_doc **)doc_02,&((fdb_kvs_handle *)(_Var23._M_i + -0xe38))->btreeblkops,
                       sVar12,pfVar24,(size_t)pcVar55,
                       &((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->fileops,
                       *(size_t *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators);
        pfVar21 = (((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).handle;
        doc = *(fdb_doc **)(_Var23._M_i + uVar58 * 8 + -0x1018);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1157db;
        fdb_set(pfVar21,doc);
        uVar58 = uVar58 + 1;
        pfVar56 = (filemgr *)((long)pfVar56 + 8);
      } while (uVar58 != 5);
      pfVar21 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->kvs_config;
      opt = *(fdb_commit_opt_t *)
             ((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->kvs_config).custom_cmp + 4);
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1157fb;
      fdb_commit((fdb_file_handle *)pfVar21,opt);
      pfVar21 = (((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).handle;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115811;
      fVar10 = fdb_snapshot_open(pfVar21,(fdb_kvs_handle **)
                                         &(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).
                                          space_used,0xffffffffffffffff);
      pvVar62 = (void *)0x5;
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115b11;
      pfVar21 = (((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).handle;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115831;
      fVar10 = fdb_set_log_callback(pfVar21,logCallbackFunc,"iterator_inmem_snapshot_seek_test");
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115b16;
      pfVar21 = (fdb_kvs_handle *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).space_used;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators = 0xe;
      pfVar24 = (fdb_doc *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x11586b;
      fdb_iterator_init(pfVar21,(fdb_iterator **)pfVar24,"b2",2,"d2",2,
                        (fdb_iterator_opt_t)
                        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators);
      pfVar3 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar24)->entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115884;
      fVar10 = fdb_iterator_seek(pfVar3,"c1",2,'\x01');
      if (fVar10 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b1b;
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1158a5;
      fVar10 = fdb_iterator_seek(pfVar3,"c3",2,'\0');
      if (fVar10 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b20;
      pfVar24 = (fdb_doc *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx;
      pfVar3 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar24)->entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1158bb;
      fdb_iterator_close(pfVar3);
      pfVar21 = (fdb_kvs_handle *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).space_used;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators = 0xe;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1158e8;
      fdb_iterator_init(pfVar21,(fdb_iterator **)pfVar24,"b3",2,"d1",2,
                        (fdb_iterator_opt_t)
                        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators);
      pfVar3 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar24)->entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115901;
      fVar10 = fdb_iterator_seek(pfVar3,"c1",2,'\x01');
      if (fVar10 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b25;
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115922;
      fVar10 = fdb_iterator_seek(pfVar3,"c3",2,'\0');
      if (fVar10 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b2a;
      pfVar24 = (fdb_doc *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx;
      pfVar3 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar24)->entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115938;
      fdb_iterator_close(pfVar3);
      pfVar21 = (fdb_kvs_handle *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).space_used;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators = 0xe;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115965;
      fdb_iterator_init(pfVar21,(fdb_iterator **)pfVar24,"b0",2,"e2",2,
                        (fdb_iterator_opt_t)
                        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->num_iterators);
      pfVar3 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar24)->entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x11596d;
      fVar10 = fdb_iterator_seek_to_max(pfVar3);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115b2f;
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115984;
      fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                       &(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).
                                        num_entries);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115b34;
      pfVar24 = (fdb_doc *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).num_entries;
      sVar13 = pfVar24->keylen;
      pvVar62 = pfVar24->key;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1159a7;
      iVar11 = bcmp(pvVar62,"d2",sVar13);
      if (iVar11 != 0) goto LAB_00115b39;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1159b7;
      fdb_doc_free(pfVar24);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).num_entries = 0;
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1159d8;
      fVar10 = fdb_iterator_seek(pfVar3,"e2",2,'\0');
      if (fVar10 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b41;
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x1159eb;
      fVar10 = fdb_iterator_seek_to_min(pfVar3);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115b46;
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a02;
      fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                       &(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).
                                        num_entries);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115b4b;
      pfVar24 = (fdb_doc *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).num_entries;
      sVar13 = pfVar24->keylen;
      pvVar62 = pfVar24->key;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a25;
      iVar11 = bcmp(pvVar62,"c2",sVar13);
      if (iVar11 != 0) goto LAB_00115b50;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a35;
      fdb_doc_free(pfVar24);
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a50;
      fVar10 = fdb_iterator_seek(pfVar3,"b0",2,'\x01');
      if (fVar10 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b58;
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a74;
      fVar10 = fdb_iterator_seek(pfVar3,"b0",2,'\x01');
      if (fVar10 == FDB_RESULT_ITERATOR_FAIL) {
        pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).entries;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a87;
        fdb_iterator_close(pfVar3);
        pfVar21 = (((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).handle;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a91;
        fdb_kvs_close(pfVar21);
        pfVar21 = (fdb_kvs_handle *)
                  (((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->bub_ctx).space_used;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115a9b;
        fdb_kvs_close(pfVar21);
        pfVar21 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1040))->kvs_config;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115aa5;
        fdb_close((fdb_file_handle *)pfVar21);
        lVar19 = 0;
        do {
          pfVar24 = *(fdb_doc **)(_Var23._M_i + lVar19 * 8 + -0x1018);
          ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115ab1;
          fdb_doc_free(pfVar24);
          lVar19 = lVar19 + 1;
        } while (lVar19 != 5);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115abf;
        fdb_shutdown();
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115ac4;
        memleak_end();
        pcVar55 = "%s PASSED\n";
        if (iterator_inmem_snapshot_seek_test(bool)::__test_pass != '\0') {
          pcVar55 = "%s FAILED\n";
        }
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115af5;
        fprintf(_stderr,pcVar55,"in-memory snapshot seek test");
        return;
      }
    }
    else {
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b0c;
      iterator_inmem_snapshot_seek_test();
LAB_00115b0c:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b11;
      iterator_inmem_snapshot_seek_test();
LAB_00115b11:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b16;
      iterator_inmem_snapshot_seek_test();
LAB_00115b16:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b1b;
      iterator_inmem_snapshot_seek_test();
LAB_00115b1b:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b20;
      iterator_inmem_snapshot_seek_test();
LAB_00115b20:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b25;
      iterator_inmem_snapshot_seek_test();
LAB_00115b25:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b2a;
      iterator_inmem_snapshot_seek_test();
LAB_00115b2a:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b2f;
      iterator_inmem_snapshot_seek_test();
LAB_00115b2f:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b34;
      iterator_inmem_snapshot_seek_test();
LAB_00115b34:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b39;
      iterator_inmem_snapshot_seek_test();
LAB_00115b39:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b41;
      iterator_inmem_snapshot_seek_test();
LAB_00115b41:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b46;
      iterator_inmem_snapshot_seek_test();
LAB_00115b46:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b4b;
      iterator_inmem_snapshot_seek_test();
LAB_00115b4b:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b50;
      iterator_inmem_snapshot_seek_test();
LAB_00115b50:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b58;
      iterator_inmem_snapshot_seek_test();
LAB_00115b58:
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)0x115b5d;
      iterator_inmem_snapshot_seek_test();
    }
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)iterator_no_deletes_test;
    iterator_inmem_snapshot_seek_test();
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->node = (kvs_opened_node *)sVar12;
    *(char **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->handle_busy = pcVar55;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->txn = (fdb_txn *)pvVar62;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->filename = (char *)pfVar56;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->max_seqnum = (fdb_seqnum_t)doc_02;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->seqnum = (fdb_seqnum_t)pfVar24;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115b82;
    gettimeofday((timeval *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->config).seqtree_opt,
                 (__timezone_ptr_t)0x0);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115b87;
    memleak_start();
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->op_stats = (kvs_ops_stat *)0x0;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115b9c;
    system("rm -rf  iterator_test* > errorlog.txt");
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115bac;
    fdb_get_default_config();
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115bbc;
    fdb_get_default_kvs_config();
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->config).compaction_cb =
         (fdb_compaction_callback)0x400;
    *(undefined4 *)
     ((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->config).compaction_cb_ctx + 4) = 1;
    *(undefined1 *)
     ((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->config).max_writer_lock_prob + 7) = 0;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115be6;
    fdb_open((fdb_file_handle **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->staletree,
             "./iterator_test",
             (fdb_config *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->config).prefetch_duration)
    ;
    pbVar63 = ((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->staletree;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115bfd;
    fdb_kvs_open((fdb_file_handle *)pbVar63,
                 (fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->fhandle,"all_docs"
                 ,(fdb_kvs_config *)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->config).compaction_minimum_filesize
                );
    __s = &(((fdb_kvs_handle *)(_Var23._M_i + -0x1248))->config).compactor_sleep_duration;
    __s_00 = &((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->seqnum;
    lVar19 = 0;
    uVar58 = 0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115c27;
      sprintf((char *)__s,"key%d",uVar58 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115c3b;
      sprintf((char *)__s_00,"body%d",uVar58 & 0xffffffff);
      lVar8 = lVar19 + -0x1410;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115c4b;
      sVar12 = strlen((char *)__s);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115c56;
      sVar13 = strlen((char *)__s_00);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp_param = (void *)sVar13;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115c70;
      fdb_doc_create((fdb_doc **)(_Var23._M_i + lVar8),__s,sVar12,(void *)0x0,0,__s_00,
                     (size_t)(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).
                             custom_cmp_param);
      pfVar21 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->fhandle;
      pfVar24 = *(fdb_doc **)(_Var23._M_i + uVar58 * 8 + -0x1410);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115c7f;
      fdb_set(pfVar21,pfVar24);
      uVar58 = uVar58 + 1;
      lVar19 = lVar19 + 8;
    } while (uVar58 != 10);
    doc_01 = (list *)0x0;
    do {
      pfVar21 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->fhandle;
      psVar6 = *(size_t **)(_Var23._M_i + (long)doc_01 * 8 + -0x1410);
      keylen = *psVar6;
      pvVar62 = (void *)psVar6[4];
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115ca4;
      fVar10 = fdb_del_kv(pfVar21,pvVar62,keylen);
      if (fVar10 != FDB_RESULT_SUCCESS) {
        (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
             (fdb_custom_cmp_variable)0x115e0c;
        iterator_no_deletes_test();
        goto LAB_00115e0c;
      }
      doc_01 = (list *)((long)&doc_01->head + 1);
    } while (doc_01 != (list *)0xa);
    pbVar63 = ((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->staletree;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115cc1;
    fdb_commit((fdb_file_handle *)pbVar63,'\0');
    pfVar21 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->fhandle;
    pfVar24 = (fdb_doc *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->dhandle;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115cd0;
    fVar10 = fdb_set(pfVar21,pfVar24);
    if (fVar10 == FDB_RESULT_SUCCESS) {
      pfVar56 = ((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->dhandle->file;
      pvVar62 = (void *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->dhandle->lastBmpRevnum;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp_param = (void *)0x0;
      doc_01 = (list *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->op_stats;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d01;
      fdb_doc_create((fdb_doc **)doc_01,pvVar62,(size_t)pfVar56,(void *)0x0,0,(void *)0x0,
                     (size_t)(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).
                             custom_cmp_param);
      pfVar21 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->fhandle;
      pfVar24 = *(fdb_doc **)doc_01;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d0e;
      fVar10 = fdb_get(pfVar21,pfVar24);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115e11;
      if ((char)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->op_stats[1].num_commits.
                super___atomic_base<unsigned_long>._M_i != '\0') {
        (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
             (fdb_custom_cmp_variable)0x115d2b;
        iterator_no_deletes_test();
      }
      pfVar24 = (fdb_doc *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->op_stats;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d35;
      fdb_doc_free(pfVar24);
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->op_stats = (kvs_ops_stat *)0x0;
      pfVar21 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->fhandle;
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp_param = 2
      ;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d5e;
      fVar10 = fdb_iterator_init(pfVar21,(fdb_iterator **)
                                         &((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->trie,
                                 (void *)0x0,0,(void *)0x0,0,
                                 *(fdb_iterator_opt_t *)
                                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).
                                   custom_cmp_param);
      if (fVar10 == FDB_RESULT_SUCCESS) {
        pfVar3 = (fdb_iterator *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->trie;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
             (fdb_custom_cmp_variable)0x115d75;
        fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                         &((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->op_stats);
        if (fVar10 == FDB_RESULT_SUCCESS) {
          pfVar24 = (fdb_doc *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->op_stats;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115d87;
          fdb_doc_free(pfVar24);
          pfVar3 = (fdb_iterator *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->trie;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115d91;
          fdb_iterator_close(pfVar3);
          lVar19 = 0;
          do {
            pfVar24 = *(fdb_doc **)(_Var23._M_i + lVar19 * 8 + -0x1410);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
                 (fdb_custom_cmp_variable)0x115d9d;
            fdb_doc_free(pfVar24);
            lVar19 = lVar19 + 1;
          } while (lVar19 != 10);
          pfVar21 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->fhandle;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115db0;
          fdb_kvs_close(pfVar21);
          pbVar63 = ((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->staletree;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115dba;
          fdb_close((fdb_file_handle *)pbVar63);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115dbf;
          fdb_shutdown();
          (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115dc4;
          memleak_end();
          pcVar55 = "%s PASSED\n";
          if (iterator_no_deletes_test()::__test_pass != '\0') {
            pcVar55 = "%s FAILED\n";
          }
          (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115df5;
          fprintf(_stderr,pcVar55,"iterator no deletes test");
          return;
        }
        goto LAB_00115e1b;
      }
    }
    else {
LAB_00115e0c:
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115e11;
      iterator_no_deletes_test();
LAB_00115e11:
      (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115e16;
      iterator_no_deletes_test();
    }
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115e1b;
    iterator_no_deletes_test();
LAB_00115e1b:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         iterator_set_del_docs_test;
    iterator_no_deletes_test();
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)(_Var23._M_i + lVar8);
    *(long *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1450))->kvs_config = lVar19;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1658))->bub_ctx).handle = (fdb_kvs_handle *)__s;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1658))->bub_ctx).space_used = 10;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1658))->bub_ctx).num_entries = (uint64_t)__s_00;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1658))->bub_ctx).entries = doc_01;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115e3d;
    gettimeofday((timeval *)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).multi_kv_instances,
                 (__timezone_ptr_t)0x0);
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115e42;
    memleak_start();
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115e52;
    fdb_get_default_config();
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115e62;
    fdb_get_default_kvs_config();
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115e6e;
    system("rm -rf  iterator_test* > errorlog.txt");
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config).encryption_key.algorithm = 0x400;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config).encryption_key.bytes[0] = '\0';
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config).encryption_key.bytes[1] = '\0';
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config).encryption_key.bytes[2] = '\0';
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config).encryption_key.bytes[3] = '\0';
    pfVar7 = &((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config;
    (pfVar7->encryption_key).bytes[0x10] = '\x01';
    (pfVar7->encryption_key).bytes[0x11] = '\0';
    (pfVar7->encryption_key).bytes[0x12] = '\0';
    (pfVar7->encryption_key).bytes[0x13] = '\0';
    (((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config).encryption_key.bytes[0x1b] = '\n';
    pfVar7 = &((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config;
    (pfVar7->encryption_key).bytes[8] = '\x01';
    (pfVar7->encryption_key).bytes[9] = '\0';
    (pfVar7->encryption_key).bytes[10] = '\0';
    (pfVar7->encryption_key).bytes[0xb] = '\0';
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115e9c;
    fdb_open((fdb_file_handle **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->fileops,
             "./iterator_test1",
             (fdb_config *)
             &(((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->config).enable_background_compactor);
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115eb3;
    fdb_kvs_open((fdb_file_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->fileops,
                 (fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->file,"kv1",
                 (fdb_kvs_config *)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).num_wal_partitions);
    psVar6 = &(((fdb_kvs_handle *)(_Var23._M_i + -0x1658))->config).max_writer_lock_prob;
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->bhandle = (btreeblk_handle *)0x0;
    iVar11 = 0;
    do {
      *(int *)((long)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->dhandle + 4) = iVar11;
      lVar19 = 0;
      uVar58 = 0;
      do {
        uVar17 = *(uint *)((long)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->dhandle + 4);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115ef3;
        sprintf((char *)psVar6,"key%02d%03d",(ulong)uVar17,uVar58 & 0xffffffff);
        __s_01 = &((fdb_kvs_handle *)(_Var23._M_i + -0x1860))->bub_ctx;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115f12;
        sprintf((char *)__s_01,"meta%02d%03d",(ulong)uVar17,uVar58 & 0xffffffff);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115f29;
        sprintf((char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).compaction_cb_ctx,
                "body%02d%03d",(ulong)uVar17,uVar58 & 0xffffffff);
        *(undefined1 **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config =
             (undefined1 *)(_Var23._M_i + lVar19 + -0x1a98);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115f40;
        sVar12 = strlen((char *)psVar6);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115f4b;
        sVar13 = strlen((char *)__s_01);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115f5b;
        sVar16 = strlen((char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).
                                 compaction_cb_ctx);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->staletree = (btree *)sVar16;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115f80;
        fdb_doc_create(*(fdb_doc ***)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config,psVar6,
                       sVar12,__s_01,sVar13,
                       &(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).compaction_cb_ctx,
                       (size_t)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->staletree);
        pfVar24 = *(fdb_doc **)(_Var23._M_i + uVar58 * 8 + -0x1a98);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115f92;
        fdb_set((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->file,pfVar24);
        uVar58 = uVar58 + 1;
        lVar19 = lVar19 + 8;
      } while (uVar58 != 100);
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115fb2;
      fdb_commit((fdb_file_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->fileops,'\x01');
      lVar19 = 0;
      do {
        pfVar24 = *(fdb_doc **)(_Var23._M_i + lVar19 * 8 + -0x19d0);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115fc6;
        fdb_del((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->file,pfVar24);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x19);
      pbVar25 = (btreeblk_handle *)
                ((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->bhandle->blockpool).head + 3);
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115fe7;
      fdb_commit((fdb_file_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->fileops,'\x01');
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x115ff6;
      fdb_get_kvs_info((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->file,
                       (fdb_kvs_info *)
                       &(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).wal_threshold);
      pbVar57 = *(btreeblk_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).seqtree_opt;
      ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->bhandle = pbVar25;
      if (pbVar57 != pbVar25) {
        *(undefined4 *)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->staletree = 0;
        uVar58 = 0;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x116025;
        fdb_iterator_init((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->file,
                          (fdb_iterator **)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->btreeblkops
                          ,(void *)0x0,0,(void *)0x0,0,
                          *(fdb_iterator_opt_t *)
                           &((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->staletree);
        do {
          ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x116037;
          fdb_iterator_get((fdb_iterator *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->btreeblkops,
                           (fdb_doc **)
                           &(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).buffercache_size);
          pfVar24 = (fdb_doc *)
                    (((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).buffercache_size;
          uVar58 = (ulong)((int)uVar58 + (pfVar24->deleted ^ 1));
          ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x11604b;
          fdb_doc_free(pfVar24);
          ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x116055;
          fVar10 = fdb_iterator_next((fdb_iterator *)
                                     ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->btreeblkops);
        } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x116064;
        fdb_iterator_close((fdb_iterator *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->btreeblkops)
        ;
        pbVar25 = ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->bhandle;
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x11607c;
        printf("dbdocs(%d) expected(%d)\n",uVar58,(ulong)pbVar25 & 0xffffffff);
      }
      if (*(btreeblk_handle **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->config).seqtree_opt !=
          pbVar25) {
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x1160b9;
        iterator_set_del_docs_test();
      }
      lVar19 = 0;
      do {
        pfVar24 = *(fdb_doc **)(_Var23._M_i + lVar19 * 8 + -0x1a98);
        ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x116092;
        fdb_doc_free(pfVar24);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 100);
      iVar11 = *(int *)((long)&((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->dhandle + 4) + 1;
    } while (iVar11 != 0x14);
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x1160c5;
    fdb_kvs_close((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->file);
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x1160cf;
    fdb_close((fdb_file_handle *)((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->fileops);
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x1160d4;
    fdb_shutdown();
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x1160d9;
    memleak_end();
    pcVar55 = "%s PASSED\n";
    if (iterator_set_del_docs_test()::__test_pass != '\0') {
      pcVar55 = "%s FAILED\n";
    }
    ((fdb_kvs_handle *)(_Var23._M_i + -0x1c70))->trie = (hbtrie *)0x11610a;
    fprintf(_stderr,pcVar55,"iterator set del docs");
    return;
  }
  pfVar18 = *(fdb_file_handle **)
             ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11332a;
  fVar10 = fdb_kvs_open(pfVar18,(fdb_kvs_handle **)
                                &((fdb_kvs_handle *)(_Var23._M_i + -0x618))->max_seqnum,"prev KVS",
                        (fdb_kvs_config *)
                        &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).num_wal_partitions);
  pcVar54 = (char *)&aStack_758;
  if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001150bc;
  pfVar18 = *(fdb_file_handle **)
             ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113350;
  fVar10 = fdb_kvs_open(pfVar18,(fdb_kvs_handle **)
                                &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key
                        ,"cur KVS",
                        (fdb_kvs_config *)
                        &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).num_wal_partitions);
  pcVar54 = (char *)&aStack_758;
  if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001150c1;
  pfVar18 = *(fdb_file_handle **)
             ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113379;
  fVar10 = fdb_kvs_open(pfVar18,(fdb_kvs_handle **)
                                &((fdb_kvs_handle *)(_Var23._M_i + -0x618))->shandle,"next KVS",
                        (fdb_kvs_config *)
                        &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).num_wal_partitions);
  pcVar54 = (char *)&aStack_758;
  if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001150c6;
  ((fdb_kvs_handle *)(_Var23._M_i + -0x618))->kv_info_offset = (uint64_t)pfVar21;
  fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
  *(void **)fconfig = (void *)0x79656b5f76657270;
  *(undefined1 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).max_writer_lock_prob = 0;
  pfVar21 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
  *(char **)pfVar21 = (char *)0x6c61765f76657270;
  *(undefined4 *)((long)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename + 7) = 0x65756c;
  pcVar55 = (char *)((fdb_kvs_handle *)(_Var23._M_i + -0x618))->max_seqnum;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1133cf;
  sVar12 = strlen(fconfig);
  doc_02 = (char *)(sVar12 + 1);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1133db;
  sVar12 = strlen((char *)pfVar21);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1133f0;
  fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar55,fconfig,(size_t)doc_02,pfVar21,sVar12 + 1);
  pcVar54 = (char *)&aStack_758;
  if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001150cb;
  pcVar59 = (char *)0x79656b5f7478656e;
  fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
  *(void **)fconfig = (void *)0x79656b5f7478656e;
  *(undefined1 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).max_writer_lock_prob = 0;
  pcVar54 = (char *)0x6c61765f7478656e;
  pfVar21 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
  *(char **)pfVar21 = (char *)0x6c61765f7478656e;
  *(undefined4 *)((long)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename + 7) = 0x65756c;
  pcVar55 = (char *)((fdb_kvs_handle *)(_Var23._M_i + -0x618))->shandle;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11343e;
  sVar12 = strlen(fconfig);
  doc_02 = (char *)(sVar12 + 1);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11344a;
  sVar12 = strlen((char *)pfVar21);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11345f;
  fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar55,fconfig,(size_t)doc_02,pfVar21,sVar12 + 1);
  if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001150d0;
  fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
  *(void **)fconfig = (void *)0x79656b5f7478656e;
  *(undefined2 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).max_writer_lock_prob = 0x32;
  pfVar21 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
  *(char **)pfVar21 = (char *)0x6c61765f7478656e;
  *(undefined4 *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->txn = 0x326575;
  pcVar55 = (char *)((fdb_kvs_handle *)(_Var23._M_i + -0x618))->shandle;
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11349b;
  sVar12 = strlen(fconfig);
  doc_02 = (char *)(sVar12 + 1);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1134a7;
  sVar12 = strlen((char *)pfVar21);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1134bc;
  fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar55,fconfig,(size_t)doc_02,pfVar21,sVar12 + 1);
  if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001150d5;
  pfVar18 = *(fdb_file_handle **)
             ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1134d3;
  fVar10 = fdb_commit(pfVar18,'\x01');
  if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001150da;
  if ((int)((fdb_kvs_handle *)(_Var23._M_i + -0x618))->kv_info_offset == 0) {
    pfVar21 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar55 = "value%08d";
    doc_02 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pcVar59 = (char *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113519;
      sprintf((char *)pfVar21,"key%06d",(ulong)pcVar59 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113529;
      sprintf(doc_02,"value%08d",(ulong)pcVar59 & 0xffffffff);
      pcVar54 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113536;
      sVar12 = strlen((char *)pfVar21);
      fconfig = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113542;
      sVar12 = strlen(doc_02);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113557;
      fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar54,pfVar21,(size_t)fconfig,doc_02,sVar12 + 1);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011502c;
      *(undefined4 *)(_Var23._M_i + (long)pcVar59 * 4 + -0x4f8) = 0;
      pcVar59 = &((fdb_kvs_config *)&((filemgr *)pcVar59)->filename)->field_0x1;
    } while ((uint8_t *)pcVar59 != (uint8_t *)0x1e);
    pfVar18 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113580;
    fVar10 = fdb_commit(pfVar18,'\x01');
    pfVar56 = (filemgr *)pcVar59;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115154;
    if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_001135f0:
      pfVar21 = (fdb_kvs_handle *)
                &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
      pcVar55 = "value%08d(WAL)";
      doc_02 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
      pcVar59 = (char *)(filemgr *)0x0;
      do {
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11361e;
        sprintf((char *)pfVar21,"key%06d",(ulong)pcVar59 & 0xffffffff);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11362e;
        sprintf(doc_02,"value%08d(WAL)",(ulong)pcVar59 & 0xffffffff);
        pcVar54 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11363b;
        sVar12 = strlen((char *)pfVar21);
        fconfig = (char *)(sVar12 + 1);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113647;
        sVar12 = strlen(doc_02);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11365c;
        fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar54,pfVar21,(size_t)fconfig,doc_02,sVar12 + 1);
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115031;
        *(undefined4 *)(_Var23._M_i + (long)pcVar59 * 4 + -0x4f8) = 1;
        pfVar56 = (filemgr *)&((fdb_kvs_config *)&((filemgr *)pcVar59)->filename)->field_0x2;
        bVar64 = pcVar59 < (filemgr *)0x1c;
        pcVar59 = (char *)pfVar56;
      } while (bVar64);
      pfVar18 = *(fdb_file_handle **)
                 ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113686;
      fVar10 = fdb_commit(pfVar18,'\0');
      if (fVar10 == FDB_RESULT_SUCCESS) {
LAB_0011368e:
        pfVar52 = *(fdb_kvs_handle **)
                   &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
        *(uint *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).max_writer_lock_prob =
             (uint)(*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.
                             bytes + 0x10) != 0) * 2;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1136b6;
        fVar10 = fdb_iterator_init(pfVar52,(fdb_iterator **)
                                           &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                            enable_background_compactor,(void *)0x0,0,(void *)0x0,0,
                                   (fdb_iterator_opt_t)
                                   (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                   max_writer_lock_prob);
        pcVar59 = (char *)pfVar56;
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001150df;
        fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                           num_bgflusher_threads;
        pcVar54 = "value%08d";
        pfVar21 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        pcVar55 = (char *)0x0;
        do {
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1136e2;
          fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)fconfig);
          if (fVar10 != FDB_RESULT_KEY_NOT_FOUND) {
            if (fVar10 != FDB_RESULT_SUCCESS) break;
            uVar17 = (int)pcVar55 +
                     (uint)(*(int *)(_Var23._M_i + (long)(int)pcVar55 * 4 + -0x4f8) == 2);
            pcVar55 = (char *)(ulong)uVar17;
            pcVar59 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) != 0) {
              pcVar59 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11371d;
            sprintf((char *)pfVar21,pcVar59,(ulong)uVar17);
            doc_02 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                             num_bgflusher_threads;
            sVar12 = ((btreeblk_handle *)doc_02)->ndeltanodes;
            pcVar59 = (char *)((btreeblk_handle *)doc_02)->log_callback;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113737;
            iVar11 = bcmp(pcVar59,pfVar21,sVar12);
            if (iVar11 != 0) goto LAB_00115060;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113747;
            fdb_doc_free((fdb_doc *)doc_02);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pcVar55 = (char *)(ulong)(uVar17 + 1);
          }
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11375d;
          fVar10 = fdb_iterator_next(pfVar3);
        } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)pcVar55 != 0x1e) goto LAB_001150e4;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11377a;
        fVar10 = fdb_iterator_prev(pfVar3);
        if (fVar10 == FDB_RESULT_ITERATOR_FAIL) {
LAB_001150b2:
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150b7;
          iterator_complete_test();
          goto LAB_001150b7;
        }
        fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                           num_bgflusher_threads;
        pcVar54 = "value%08d";
        pfVar21 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        do {
          uVar17 = (int)pcVar55 - 1;
          pcVar55 = (char *)(ulong)uVar17;
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1137a7;
          fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)fconfig);
          if (fVar10 != FDB_RESULT_KEY_NOT_FOUND) {
            if (fVar10 != FDB_RESULT_SUCCESS) break;
            uVar17 = uVar17 - (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) == 2);
            pcVar55 = (char *)(ulong)uVar17;
            pcVar59 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) != 0) {
              pcVar59 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1137e2;
            sprintf((char *)pfVar21,pcVar59,(ulong)uVar17);
            doc_02 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                             num_bgflusher_threads;
            sVar12 = ((btreeblk_handle *)doc_02)->ndeltanodes;
            pcVar59 = (char *)((btreeblk_handle *)doc_02)->log_callback;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1137fc;
            iVar11 = bcmp(pcVar59,pfVar21,sVar12);
            if (iVar11 != 0) goto LAB_00115070;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11380c;
            fdb_doc_free((fdb_doc *)doc_02);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
          }
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11381f;
          fVar10 = fdb_iterator_prev(pfVar3);
        } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)pcVar55 != 0) goto LAB_001150b2;
        pcVar55 = "key%06d";
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar54 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        pfVar21 = (fdb_kvs_handle *)0x0;
        do {
          if (pfVar21 == (fdb_kvs_handle *)0x1e) goto LAB_00113950;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113865;
          sprintf(doc_02,"key%06d",(ulong)pfVar21 & 0xffffffff);
          fconfig = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                               enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113872;
          sVar12 = strlen(doc_02);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113883;
          fVar10 = fdb_iterator_seek((fdb_iterator *)fconfig,doc_02,sVar12 + 1,'\0');
          if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00114ffa;
          iVar11 = *(int *)(_Var23._M_i + (long)pfVar21 * 4 + -0x4f8);
          puVar1 = &(pfVar21->kvs_config).field_0x1;
          *(uint8_t **)
           ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x14) =
               puVar1;
          uVar58 = (ulong)puVar1 & 0xffffffff;
          if (iVar11 != 2) {
            uVar58 = (ulong)pfVar21 & 0xffffffff;
          }
          do {
            uVar17 = (uint)uVar58;
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1138ad;
            fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar10 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1138c4;
            sprintf(doc_02,"key%06d",uVar58);
            uVar17 = uVar17 + (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) == 2);
            pcVar59 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) != 0) {
              pcVar59 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1138f7;
            sprintf(pcVar54,pcVar59,(ulong)uVar17);
            pfVar21 = (fdb_kvs_handle *)
                      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads;
            pvVar62 = (pfVar21->kvs_config).custom_cmp_param;
            pcVar59 = (char *)(pfVar21->field_6).seqtree;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11390f;
            iVar11 = bcmp(pcVar59,pcVar54,(size_t)pvVar62);
            if (iVar11 != 0) {
              (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                   (void *)0x114f8a;
              iterator_complete_test();
              goto LAB_00114f8a;
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11391f;
            fdb_doc_free((fdb_doc *)pfVar21);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            uVar17 = uVar17 + 1;
            uVar58 = (ulong)uVar17;
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113934;
            fVar10 = fdb_iterator_next(pfVar3);
          } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
          pfVar21 = *(fdb_kvs_handle **)
                     ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes +
                     0x14);
        } while (uVar17 == 0x1e);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113950;
        iterator_complete_test();
LAB_00113950:
        pcVar55 = "key%06d";
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar54 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        pfVar21 = (fdb_kvs_handle *)0x0;
        do {
          if (pfVar21 == (fdb_kvs_handle *)0x1e) goto LAB_00113a6f;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113984;
          sprintf(doc_02,"key%06d",(ulong)pfVar21 & 0xffffffff);
          fconfig = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                               enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113991;
          sVar12 = strlen(doc_02);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1139a2;
          fVar10 = fdb_iterator_seek((fdb_iterator *)fconfig,doc_02,sVar12 + 1,'\0');
          if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00114fff;
          iVar11 = *(int *)(_Var23._M_i + (long)pfVar21 * 4 + -0x4f8);
          puVar1 = &(pfVar21->kvs_config).field_0x1;
          *(uint8_t **)
           ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x14) =
               puVar1;
          uVar58 = (ulong)puVar1 & 0xffffffff;
          if (iVar11 != 2) {
            uVar58 = (ulong)pfVar21 & 0xffffffff;
          }
          do {
            uVar17 = (uint)uVar58;
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1139cc;
            fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar10 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1139e3;
            sprintf(doc_02,"key%06d",uVar58);
            uVar17 = uVar17 - (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) == 2);
            pcVar59 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) != 0) {
              pcVar59 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a16;
            sprintf(pcVar54,pcVar59,(ulong)uVar17);
            pfVar21 = (fdb_kvs_handle *)
                      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads;
            pvVar62 = (pfVar21->kvs_config).custom_cmp_param;
            pcVar59 = (char *)(pfVar21->field_6).seqtree;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a2e;
            iVar11 = bcmp(pcVar59,pcVar54,(size_t)pvVar62);
            if (iVar11 != 0) goto LAB_00114f8a;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a3e;
            fdb_doc_free((fdb_doc *)pfVar21);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            uVar17 = uVar17 - 1;
            uVar58 = (ulong)uVar17;
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a53;
            fVar10 = fdb_iterator_prev(pfVar3);
          } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
          pfVar21 = *(fdb_kvs_handle **)
                     ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes +
                     0x14);
        } while (uVar17 == 0xffffffff);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113a6f;
        iterator_complete_test();
LAB_00113a6f:
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar54 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        fconfig = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113a94;
          sprintf(doc_02,"key%06d",(ulong)fconfig & 0xffffffff);
          pfVar21 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113aa1;
          sVar12 = strlen(doc_02);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113ab5;
          fVar10 = fdb_iterator_seek((fdb_iterator *)pfVar21,doc_02,sVar12 + 1,'\x01');
          if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115004;
          pfVar21 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig -
                           (uint)(*(int *)(_Var23._M_i + (long)fconfig * 4 + -0x4f8) == 2));
          do {
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113adc;
            fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar10 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113af8;
            sprintf(doc_02,"key%06d",pfVar21);
            uVar17 = (int)pfVar21 +
                     (uint)(*(int *)(_Var23._M_i + (long)(int)pfVar21 * 4 + -0x4f8) == 2);
            pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
            pcVar55 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) != 0) {
              pcVar55 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b2e;
            sprintf(pcVar54,pcVar55,(ulong)uVar17);
            pcVar59 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                              num_bgflusher_threads;
            paVar4 = ((avl_node *)&((filemgr *)pcVar59)->blocksize)->parent;
            pcVar55 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar59)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b46;
            iVar11 = bcmp(pcVar55,pcVar54,(size_t)paVar4);
            if (iVar11 != 0) goto LAB_00114f9a;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b56;
            fdb_doc_free((fdb_doc *)pcVar59);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar21 = (fdb_kvs_handle *)(ulong)(uVar17 + 1);
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b6c;
            fVar10 = fdb_iterator_next(pfVar3);
          } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar21 != 0x1e) goto LAB_00115009;
          fconfig = (char *)((long)&((fdb_iterator *)fconfig)->handle + 1);
        } while ((fdb_iterator *)fconfig != (fdb_iterator *)0x1e);
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar54 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        fconfig = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113bb1;
          sprintf(doc_02,"key%06d",(ulong)fconfig & 0xffffffff);
          pfVar21 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113bbe;
          sVar12 = strlen(doc_02);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113bd2;
          fVar10 = fdb_iterator_seek((fdb_iterator *)pfVar21,doc_02,sVar12 + 1,'\x01');
          if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011500e;
          pfVar21 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig -
                           (uint)(*(int *)(_Var23._M_i + (long)fconfig * 4 + -0x4f8) == 2));
          do {
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113bf9;
            fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar10 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c15;
            sprintf(doc_02,"key%06d",pfVar21);
            uVar17 = (int)pfVar21 -
                     (uint)(*(int *)(_Var23._M_i + (long)(int)pfVar21 * 4 + -0x4f8) == 2);
            pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
            pcVar55 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) != 0) {
              pcVar55 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c4b;
            sprintf(pcVar54,pcVar55,(ulong)uVar17);
            pcVar59 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                              num_bgflusher_threads;
            paVar4 = ((avl_node *)&((filemgr *)pcVar59)->blocksize)->parent;
            pcVar55 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar59)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c63;
            iVar11 = bcmp(pcVar55,pcVar54,(size_t)paVar4);
            if (iVar11 != 0) goto LAB_00114faa;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c73;
            fdb_doc_free((fdb_doc *)pcVar59);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar21 = (fdb_kvs_handle *)(ulong)(uVar17 - 1);
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c89;
            fVar10 = fdb_iterator_prev(pfVar3);
          } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar21 != -1) goto LAB_00115013;
          fconfig = (char *)((long)&((fdb_iterator *)fconfig)->handle + 1);
        } while ((fdb_iterator *)fconfig != (fdb_iterator *)0x1e);
        pcVar55 = "key%06d+";
        fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar59 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        uVar58 = 0;
        do {
          if (uVar58 == 0x1e) goto LAB_00113dc7;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113cdb;
          sprintf(fconfig,"key%06d+",uVar58 & 0xffffffff);
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113ce8;
          sVar12 = strlen(fconfig);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113cf9;
          fdb_iterator_seek(pfVar3,fconfig,sVar12 + 1,'\0');
          iVar11 = *(int *)(_Var23._M_i + uVar58 * 4 + -0x4f4);
          *(ulong *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes +
                    0x14) = uVar58 + 1;
          uVar61 = (ulong)((int)uVar58 + 2);
          if (iVar11 != 2) {
            uVar61 = uVar58 + 1 & 0xffffffff;
          }
          do {
            uVar17 = (uint)uVar61;
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d1e;
            fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar10 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d36;
            sprintf(fconfig,"key%06d+",uVar61);
            uVar17 = uVar17 + (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) == 2);
            pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
            pcVar54 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) != 0) {
              pcVar54 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d6c;
            sprintf(pcVar59,pcVar54,(ulong)uVar17);
            pcVar54 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                              num_bgflusher_threads;
            aVar53 = *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar54 + 0x10);
            doc_02 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                             ((long)pcVar54 + 0x40))->seqtree;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d84;
            iVar11 = bcmp(doc_02,pcVar59,(size_t)aVar53);
            if (iVar11 != 0) goto LAB_00114fba;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d94;
            fdb_doc_free((fdb_doc *)pcVar54);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            uVar17 = uVar17 + 1;
            uVar61 = (ulong)uVar17;
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113daa;
            fVar10 = fdb_iterator_next(pfVar3);
          } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
          uVar58 = *(ulong *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.
                              bytes + 0x14);
        } while (uVar17 == 0x1e);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113dc7;
        iterator_complete_test();
LAB_00113dc7:
        pcVar55 = "key%06d+";
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar54 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        pcVar59 = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113df1;
          sprintf(doc_02,"key%06d+",(ulong)pcVar59 & 0xffffffff);
          fconfig = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                               enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113dfe;
          sVar12 = strlen(doc_02);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113e0f;
          fdb_iterator_seek((fdb_iterator *)fconfig,doc_02,sVar12 + 1,'\0');
          puVar1 = &((fdb_kvs_config *)&((filemgr *)pcVar59)->filename)->field_0x1;
          *(char **)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes +
                    0x14) = pcVar59;
          iVar11 = *(int *)(_Var23._M_i + (long)pcVar59 * 4 + -0x4f4);
          ((fdb_kvs_handle *)(_Var23._M_i + -0x618))->seqnum = (fdb_seqnum_t)puVar1;
          pfVar21 = (fdb_kvs_handle *)(ulong)((int)pcVar59 + 2);
          if (iVar11 != 2) {
            pfVar21 = (fdb_kvs_handle *)((ulong)puVar1 & 0xffffffff);
          }
          do {
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113e3d;
            fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar10 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113e55;
            sprintf(doc_02,"key%06d+",pfVar21);
            uVar17 = (int)pfVar21 -
                     (uint)(*(int *)(_Var23._M_i + (long)(int)pfVar21 * 4 + -0x4f8) == 2);
            pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
            pcVar59 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) != 0) {
              pcVar59 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113e8b;
            sprintf(pcVar54,pcVar59,(ulong)uVar17);
            fconfig = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                              num_bgflusher_threads;
            pbVar5 = ((fdb_iterator *)fconfig)->seqtree_iterator;
            pcVar59 = (char *)((fdb_iterator *)fconfig)->tree_cursor_prev;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113ea3;
            iVar11 = bcmp(pcVar59,pcVar54,(size_t)pbVar5);
            if (iVar11 != 0) goto LAB_00114fca;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113eb3;
            fdb_doc_free((fdb_doc *)fconfig);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar21 = (fdb_kvs_handle *)(ulong)(uVar17 - 1);
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113ec9;
            fVar10 = fdb_iterator_prev(pfVar3);
          } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
          if (*(long *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes +
                       0x14) == 0x1d) {
            if ((int)pfVar21 != 0x1e) goto LAB_00115036;
          }
          else if ((int)pfVar21 != -1) goto LAB_0011503b;
          pcVar59 = (char *)((fdb_kvs_handle *)(_Var23._M_i + -0x618))->seqnum;
        } while ((filemgr *)pcVar59 != (filemgr *)0x1e);
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar54 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        fconfig = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113f26;
          sprintf(doc_02,"key%06d+",(ulong)fconfig & 0xffffffff);
          pfVar21 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113f33;
          sVar12 = strlen(doc_02);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113f47;
          fVar10 = fdb_iterator_seek((fdb_iterator *)pfVar21,doc_02,sVar12 + 1,'\x01');
          if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115018;
          pfVar21 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig -
                           (uint)(*(int *)(_Var23._M_i + (long)fconfig * 4 + -0x4f8) == 2));
          do {
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113f6e;
            fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar10 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113f8a;
            sprintf(doc_02,"key%06d+",pfVar21);
            uVar17 = (int)pfVar21 +
                     (uint)(*(int *)(_Var23._M_i + (long)(int)pfVar21 * 4 + -0x4f8) == 2);
            pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
            pcVar55 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) != 0) {
              pcVar55 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113fc0;
            sprintf(pcVar54,pcVar55,(ulong)uVar17);
            pcVar59 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                              num_bgflusher_threads;
            paVar4 = ((avl_node *)&((filemgr *)pcVar59)->blocksize)->parent;
            pcVar55 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar59)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113fd8;
            iVar11 = bcmp(pcVar55,pcVar54,(size_t)paVar4);
            if (iVar11 != 0) goto LAB_00114fda;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113fe8;
            fdb_doc_free((fdb_doc *)pcVar59);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar21 = (fdb_kvs_handle *)(ulong)(uVar17 + 1);
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113ffe;
            fVar10 = fdb_iterator_next(pfVar3);
          } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar21 != 0x1e) goto LAB_0011501d;
          fconfig = (char *)((long)&((fdb_iterator *)fconfig)->handle + 1);
        } while ((fdb_iterator *)fconfig != (fdb_iterator *)0x1e);
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar54 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        fconfig = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114043;
          sprintf(doc_02,"key%06d+",(ulong)fconfig & 0xffffffff);
          pfVar21 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114050;
          sVar12 = strlen(doc_02);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114064;
          fVar10 = fdb_iterator_seek((fdb_iterator *)pfVar21,doc_02,sVar12 + 1,'\x01');
          if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115022;
          pfVar21 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig -
                           (uint)(*(int *)(_Var23._M_i + (long)fconfig * 4 + -0x4f8) == 2));
          do {
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11408b;
            fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                             &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                              num_bgflusher_threads);
            if (fVar10 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1140a7;
            sprintf(doc_02,"key%06d+",pfVar21);
            uVar17 = (int)pfVar21 -
                     (uint)(*(int *)(_Var23._M_i + (long)(int)pfVar21 * 4 + -0x4f8) == 2);
            pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
            pcVar55 = "value%08d";
            if (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) != 0) {
              pcVar55 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1140dd;
            sprintf(pcVar54,pcVar55,(ulong)uVar17);
            pcVar59 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                              num_bgflusher_threads;
            paVar4 = ((avl_node *)&((filemgr *)pcVar59)->blocksize)->parent;
            pcVar55 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar59)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1140f5;
            iVar11 = bcmp(pcVar55,pcVar54,(size_t)paVar4);
            if (iVar11 != 0) goto LAB_00114fea;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x114105;
            fdb_doc_free((fdb_doc *)pcVar59);
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar21 = (fdb_kvs_handle *)(ulong)(uVar17 - 1);
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11411b;
            fVar10 = fdb_iterator_prev(pfVar3);
          } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar21 != -1) goto LAB_00115027;
          fconfig = (char *)((long)&((fdb_iterator *)fconfig)->handle + 1);
        } while ((fdb_iterator *)fconfig != (fdb_iterator *)0x1e);
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114145;
        fVar10 = fdb_iterator_seek_to_min(pfVar3);
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001150e9;
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar55 = "value%08d";
        pcVar59 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        pfVar21 = (fdb_kvs_handle *)0x0;
        do {
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114176;
          fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                           &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                            num_bgflusher_threads);
          if (fVar10 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114192;
          sprintf(doc_02,"key%06d+",pfVar21);
          uVar17 = (int)pfVar21 +
                   (uint)(*(int *)(_Var23._M_i + (long)(int)pfVar21 * 4 + -0x4f8) == 2);
          pfVar21 = (fdb_kvs_handle *)(ulong)uVar17;
          pcVar54 = "value%08d";
          if (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) != 0) {
            pcVar54 = "value%08d(WAL)";
          }
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1141c4;
          sprintf(pcVar59,pcVar54,(ulong)uVar17);
          pcVar54 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                            num_bgflusher_threads;
          aVar53 = *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar54 + 0x10);
          fconfig = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar54 + 0x40)
                            )->seqtree;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1141dc;
          iVar11 = bcmp(fconfig,pcVar59,(size_t)aVar53);
          if (iVar11 != 0) goto LAB_00115040;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1141ec;
          fdb_doc_free((fdb_doc *)pcVar54);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
          pfVar21 = (fdb_kvs_handle *)(ulong)(uVar17 + 1);
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114202;
          fVar10 = fdb_iterator_next(pfVar3);
        } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)pfVar21 != 0x1e) goto LAB_001150ee;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11421f;
        fVar10 = fdb_iterator_seek_to_max(pfVar3);
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001150f3;
        fconfig = (char *)0x1d;
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar55 = "value%08d";
        pcVar59 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        do {
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114252;
          fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                           &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                            num_bgflusher_threads);
          if (fVar10 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11426d;
          sprintf(doc_02,"key%06d+",fconfig);
          uVar17 = (int)fconfig -
                   (uint)(*(int *)(_Var23._M_i + (long)(int)fconfig * 4 + -0x4f8) == 2);
          fconfig = (char *)(ulong)uVar17;
          pcVar54 = "value%08d";
          if (*(int *)(_Var23._M_i + (long)(int)uVar17 * 4 + -0x4f8) != 0) {
            pcVar54 = "value%08d(WAL)";
          }
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11429c;
          sprintf(pcVar59,pcVar54,(ulong)uVar17);
          pcVar54 = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                            num_bgflusher_threads;
          aVar53 = *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar54 + 0x10);
          pfVar21 = (fdb_kvs_handle *)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar54 + 0x40))->
                    seqtree;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142b4;
          iVar11 = bcmp(pfVar21,pcVar59,(size_t)aVar53);
          if (iVar11 != 0) goto LAB_00115050;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142c4;
          fdb_doc_free((fdb_doc *)pcVar54);
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
          fconfig = (char *)(ulong)(uVar17 - 1);
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142d9;
          fVar10 = fdb_iterator_prev(pfVar3);
        } while (fVar10 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)fconfig != -1) goto LAB_001150f8;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142f5;
        fVar10 = fdb_iterator_close(pfVar3);
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001150fd;
        fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11431b;
        sprintf(fconfig,"key%06d",0x14);
        pfVar21 = *(fdb_kvs_handle **)
                   &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114328;
        sVar12 = strlen(fconfig);
        *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).max_writer_lock_prob =
             8;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114347;
        fVar10 = fdb_iterator_init(pfVar21,(fdb_iterator **)
                                           &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                            enable_background_compactor,(void *)0x0,0,fconfig,
                                   sVar12 + 1,
                                   (fdb_iterator_opt_t)
                                   (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                   max_writer_lock_prob);
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115102;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114359;
        fVar10 = fdb_iterator_seek_to_max(pfVar3);
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115107;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114370;
        fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                         &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                          num_bgflusher_threads);
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011510c;
        pcVar59 = "value%08d";
        fconfig = "value%08d(WAL)";
        pcVar55 = "value%08d(WAL)";
        if (*(int *)((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->log_callback).callback + 4)
            == 0) {
          pcVar55 = "value%08d";
        }
        doc_02 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143ac;
        sprintf(doc_02,pcVar55,0x13);
        pfVar21 = (fdb_kvs_handle *)
                  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads;
        pvVar62 = (pfVar21->kvs_config).custom_cmp_param;
        pcVar55 = (char *)(pfVar21->field_6).seqtree;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143c4;
        iVar11 = bcmp(pcVar55,doc_02,(size_t)pvVar62);
        if (iVar11 != 0) goto LAB_00115111;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143d4;
        fdb_doc_free((fdb_doc *)pfVar21);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143e7;
        fVar10 = fdb_iterator_close(pfVar3);
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115121;
        pfVar21 = (fdb_kvs_handle *)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11440d;
        sprintf((char *)pfVar21,"key%06d",10);
        pcVar55 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11441a;
        sVar12 = strlen((char *)pfVar21);
        *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).max_writer_lock_prob =
             4;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11443b;
        fVar10 = fdb_iterator_init((fdb_kvs_handle *)pcVar55,
                                   (fdb_iterator **)
                                   &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                    enable_background_compactor,pfVar21,sVar12 + 1,(void *)0x0,0,
                                   (fdb_iterator_opt_t)
                                   (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                   max_writer_lock_prob);
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115126;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11444d;
        fVar10 = fdb_iterator_seek_to_min(pfVar3);
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011512b;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114464;
        fVar10 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                         &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                                          num_bgflusher_threads);
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115130;
        if (*(int *)((long)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).
                            breakpad_minidump_dir + 4) == 0) {
          fconfig = "value%08d";
        }
        pcVar55 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11448f;
        sprintf(pcVar55,fconfig,0xb);
        fconfig = (char *)(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads
        ;
        pbVar5 = ((fdb_iterator *)fconfig)->seqtree_iterator;
        pfVar21 = (fdb_kvs_handle *)((fdb_iterator *)fconfig)->tree_cursor_prev;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144a7;
        iVar11 = bcmp(pfVar21,pcVar55,(size_t)pbVar5);
        if (iVar11 != 0) goto LAB_00115135;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144b7;
        fdb_doc_free((fdb_doc *)fconfig);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).num_bgflusher_threads = 0;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144ca;
        fVar10 = fdb_iterator_close(pfVar3);
        fconfig = (char *)((fdb_kvs_handle *)(_Var23._M_i + -0x618))->kv_info_offset;
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115145;
        pfVar18 = *(fdb_file_handle **)
                   ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144e4;
        fVar10 = fdb_close(pfVar18);
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011514a;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144f1;
        fVar10 = fdb_shutdown();
        if (fVar10 == FDB_RESULT_SUCCESS) {
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144fe;
          memleak_end();
          (((fdb_kvs_handle *)(_Var23._M_i + -0x410))->bub_ctx).entries = (list *)0x20747365742065;
          ((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node = (kvs_opened_node *)0x726f746172657469;
          *(undefined8 *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->num_iterators =
               0x74656c706d6f6320;
          if ((int)fconfig != 0) goto LAB_0011472c;
          (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114534;
          sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
          builtin_strncpy((char *)(_Var23._M_i + (sVar12 - 0x238)),"(HB+trie: all, W",0x10);
          uVar65._0_1_ = ' ';
          uVar65._1_1_ = 'a';
          uVar65._2_1_ = 'l';
          uVar65._3_1_ = 'l';
          uVar67._0_1_ = ',';
          uVar67._1_1_ = ' ';
          uVar67._2_1_ = 'W';
          uVar67._3_1_ = 'A';
          uVar69._0_1_ = 'L';
          uVar69._1_1_ = ':';
          uVar69._2_1_ = ' ';
          uVar69._3_1_ = 'e';
          uVar71._0_1_ = 'v';
          uVar71._1_1_ = 'e';
          uVar71._2_1_ = 'n';
          uVar71._3_1_ = '\0';
          goto LAB_0011454a;
        }
        goto LAB_0011514f;
      }
      goto LAB_00115159;
    }
    fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135ad;
    sprintf(fconfig,"key%06d",0xf);
    pfVar21 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135ba;
    sVar12 = strlen(fconfig);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135c9;
    fVar10 = fdb_del_kv(pfVar21,fconfig,sVar12 + 1);
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011515e;
    pfVar18 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135e0;
    fVar10 = fdb_commit(pfVar18,'\x01');
    if (fVar10 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_001135f0;
    }
    goto LAB_00115163;
  }
  switch((int)((fdb_kvs_handle *)(_Var23._M_i + -0x618))->kv_info_offset) {
  case 1:
    pfVar21 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar55 = "value%08d";
    doc_02 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar56 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145c6;
      sprintf((char *)pfVar21,"key%06d",(ulong)pfVar56 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145d6;
      sprintf(doc_02,"value%08d",(ulong)pfVar56 & 0xffffffff);
      pcVar54 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145e3;
      sVar12 = strlen((char *)pfVar21);
      fconfig = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145ef;
      sVar12 = strlen(doc_02);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114604;
      fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar54,pfVar21,(size_t)fconfig,doc_02,sVar12 + 1);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115080;
      *(undefined4 *)(_Var23._M_i + (long)pfVar56 * 4 + -0x4f8) = 0;
      pfVar56 = (filemgr *)&((fdb_kvs_config *)&pfVar56->filename)->field_0x1;
    } while (pfVar56 != (filemgr *)0x1e);
    pfVar18 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11462d;
    fVar10 = fdb_commit(pfVar18,'\x01');
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115168;
    pcVar55 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    doc_02 = "value%08d(WAL)";
    pfVar56 = (filemgr *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar52 = (fdb_kvs_handle *)0x1;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114666;
      sprintf(pcVar55,"key%06d",(ulong)pfVar52 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114676;
      sprintf((char *)pfVar56,"value%08d(WAL)",(ulong)pfVar52 & 0xffffffff);
      pcVar54 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114683;
      sVar12 = strlen(pcVar55);
      fconfig = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11468f;
      sVar12 = strlen((char *)pfVar56);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146a4;
      fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar54,pcVar55,(size_t)fconfig,pfVar56,sVar12 + 1);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011509e;
      *(undefined4 *)(_Var23._M_i + (long)pfVar52 * 4 + -0x4f8) = 1;
      pfVar21 = (fdb_kvs_handle *)&(pfVar52->kvs_config).field_0x2;
      bVar64 = pfVar52 < (fdb_kvs_handle *)0x1c;
      pfVar52 = pfVar21;
    } while (bVar64);
    if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        != 0) {
      fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146e7;
      sprintf(fconfig,"key%06d",0xf);
      pfVar21 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146f4;
      sVar12 = strlen(fconfig);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114703;
      fVar10 = fdb_del_kv(pfVar21,fconfig,sVar12 + 1);
      if (fVar10 == FDB_RESULT_SUCCESS) {
        *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).do_not_cache_doc_blocks
             = 2;
        goto LAB_00114713;
      }
      goto LAB_0011519a;
    }
LAB_00114713:
    pfVar18 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11471f;
    fVar10 = fdb_commit(pfVar18,'\0');
    if (fVar10 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11472c;
    iterator_complete_test();
    break;
  case 2:
switchD_00114596_caseD_2:
    pcVar55 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    doc_02 = "value%08d";
    pfVar56 = (filemgr *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar21 = (fdb_kvs_handle *)0x1;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b97;
      sprintf(pcVar55,"key%06d",(ulong)pfVar21 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ba7;
      sprintf((char *)pfVar56,"value%08d",(ulong)pfVar21 & 0xffffffff);
      pcVar54 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114bb4;
      sVar12 = strlen(pcVar55);
      fconfig = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114bc0;
      sVar12 = strlen((char *)pfVar56);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114bd5;
      fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar54,pcVar55,(size_t)fconfig,pfVar56,sVar12 + 1);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115094;
      *(undefined4 *)(_Var23._M_i + (long)pfVar21 * 4 + -0x4f8) = 0;
      pfVar52 = (fdb_kvs_handle *)&(pfVar21->kvs_config).field_0x2;
      bVar64 = pfVar21 < (fdb_kvs_handle *)0x1c;
      pfVar21 = pfVar52;
    } while (bVar64);
    pfVar18 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c02;
    fVar10 = fdb_commit(pfVar18,'\x01');
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011517c;
    if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114c72:
      pfVar21 = (fdb_kvs_handle *)
                &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
      pcVar55 = "value%08d(WAL)";
      doc_02 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
      pcVar59 = (char *)(filemgr *)0x0;
      do {
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ca0;
        sprintf((char *)pfVar21,"key%06d",(ulong)pcVar59 & 0xffffffff);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cb0;
        sprintf(doc_02,"value%08d(WAL)",(ulong)pcVar59 & 0xffffffff);
        pcVar54 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cbd;
        sVar12 = strlen((char *)pfVar21);
        fconfig = (char *)(sVar12 + 1);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cc9;
        sVar12 = strlen(doc_02);
        (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cde;
        fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar54,pfVar21,(size_t)fconfig,doc_02,sVar12 + 1);
        if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001150ad;
        *(undefined4 *)(_Var23._M_i + (long)pcVar59 * 4 + -0x4f8) = 1;
        pfVar56 = (filemgr *)&((fdb_kvs_config *)&((filemgr *)pcVar59)->filename)->field_0x2;
        bVar64 = pcVar59 < (filemgr *)0x1c;
        pcVar59 = (char *)pfVar56;
      } while (bVar64);
      pfVar18 = *(fdb_file_handle **)
                 ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d08;
      fVar10 = fdb_commit(pfVar18,'\0');
      if (fVar10 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d15;
      iterator_complete_test();
      goto switchD_00114596_default;
    }
    fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c2f;
    sprintf(fconfig,"key%06d",0xf);
    pfVar21 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c3c;
    sVar12 = strlen(fconfig);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c4b;
    fVar10 = fdb_del_kv(pfVar21,fconfig,sVar12 + 1);
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115190;
    pfVar18 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c62;
    fVar10 = fdb_commit(pfVar18,'\x01');
    if (fVar10 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114c72;
    }
    goto LAB_00115195;
  case 3:
switchD_00114596_caseD_3:
    pfVar21 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar55 = "value%08d";
    doc_02 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar60 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1148f2;
      sprintf((char *)pfVar21,"key%06d",(ulong)pfVar60 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114902;
      sprintf(doc_02,"value%08d",(ulong)pfVar60 & 0xffffffff);
      pcVar54 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11490f;
      sVar12 = strlen((char *)pfVar21);
      fconfig = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11491b;
      sVar12 = strlen(doc_02);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114930;
      fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar54,pfVar21,(size_t)fconfig,doc_02,sVar12 + 1);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011508a;
      *(undefined4 *)(_Var23._M_i + (long)pfVar60 * 4 + -0x4f8) = 0;
      pfVar56 = (filemgr *)&((fdb_kvs_config *)&pfVar60->filename)->field_0x2;
      bVar64 = pfVar60 < (filemgr *)0x1c;
      pfVar60 = pfVar56;
    } while (bVar64);
    pfVar18 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11495d;
    fVar10 = fdb_commit(pfVar18,'\x01');
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115172;
    pcVar55 = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    doc_02 = "value%08d(WAL)";
    pfVar56 = (filemgr *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar52 = (fdb_kvs_handle *)0x1;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114996;
      sprintf(pcVar55,"key%06d",(ulong)pfVar52 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149a6;
      sprintf((char *)pfVar56,"value%08d(WAL)",(ulong)pfVar52 & 0xffffffff);
      pcVar54 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149b3;
      sVar12 = strlen(pcVar55);
      fconfig = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149bf;
      sVar12 = strlen((char *)pfVar56);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149d4;
      fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar54,pcVar55,(size_t)fconfig,pfVar56,sVar12 + 1);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001150a3;
      *(undefined4 *)(_Var23._M_i + (long)pfVar52 * 4 + -0x4f8) = 1;
      pfVar21 = (fdb_kvs_handle *)&(pfVar52->kvs_config).field_0x2;
      bVar64 = pfVar52 < (fdb_kvs_handle *)0x1c;
      pfVar52 = pfVar21;
    } while (bVar64);
    if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114a43:
      pfVar18 = *(fdb_file_handle **)
                 ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a4f;
      fVar10 = fdb_commit(pfVar18,'\0');
      if (fVar10 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a5c;
      iterator_complete_test();
      goto switchD_00114596_caseD_4;
    }
    fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a17;
    sprintf(fconfig,"key%06d",0xf);
    pfVar21 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a24;
    sVar12 = strlen(fconfig);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a33;
    fVar10 = fdb_del_kv(pfVar21,fconfig,sVar12 + 1);
    if (fVar10 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114a43;
    }
    goto LAB_0011519f;
  case 4:
switchD_00114596_caseD_4:
    pfVar21 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar55 = "value%08d";
    doc_02 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar56 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a8a;
      sprintf((char *)pfVar21,"key%06d",(ulong)pfVar56 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a9a;
      sprintf(doc_02,"value%08d",(ulong)pfVar56 & 0xffffffff);
      pcVar54 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114aa7;
      sVar12 = strlen((char *)pfVar21);
      fconfig = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ab3;
      sVar12 = strlen(doc_02);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ac8;
      fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar54,pfVar21,(size_t)fconfig,doc_02,sVar12 + 1);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011508f;
      *(undefined4 *)(_Var23._M_i + (long)pfVar56 * 4 + -0x4f8) = 0;
      pfVar56 = (filemgr *)&((fdb_kvs_config *)&pfVar56->filename)->field_0x1;
    } while (pfVar56 != (filemgr *)0x1e);
    pfVar18 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114af1;
    fVar10 = fdb_commit(pfVar18,'\x01');
    pfVar52 = pfVar21;
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115177;
    if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114b4a:
      pfVar18 = *(fdb_file_handle **)
                 ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b59;
      fVar10 = fdb_commit(pfVar18,'\x01');
      if (fVar10 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b66;
      iterator_complete_test();
      goto switchD_00114596_caseD_2;
    }
    fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b1e;
    sprintf(fconfig,"key%06d",0xf);
    pfVar21 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b2b;
    sVar12 = strlen(fconfig);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b3a;
    fVar10 = fdb_del_kv(pfVar21,fconfig,sVar12 + 1);
    if (fVar10 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114b4a;
    }
    goto LAB_0011518b;
  case 5:
    pfVar21 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar55 = "value%08d";
    doc_02 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar56 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1147ee;
      sprintf((char *)pfVar21,"key%06d",(ulong)pfVar56 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1147fe;
      sprintf(doc_02,"value%08d",(ulong)pfVar56 & 0xffffffff);
      pcVar54 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11480b;
      sVar12 = strlen((char *)pfVar21);
      fconfig = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114817;
      sVar12 = strlen(doc_02);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11482c;
      fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar54,pfVar21,(size_t)fconfig,doc_02,sVar12 + 1);
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115085;
      *(undefined4 *)(_Var23._M_i + (long)pfVar56 * 4 + -0x4f8) = 0;
      pfVar56 = (filemgr *)&((fdb_kvs_config *)&pfVar56->filename)->field_0x1;
    } while (pfVar56 != (filemgr *)0x1e);
    pfVar18 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114852;
    fVar10 = fdb_commit(pfVar18,'\0');
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0011516d;
    if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_001148ab:
      pfVar18 = *(fdb_file_handle **)
                 ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1148b7;
      fVar10 = fdb_commit(pfVar18,'\0');
      if (fVar10 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1148c4;
      iterator_complete_test();
      goto switchD_00114596_caseD_3;
    }
    fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11487f;
    sprintf(fconfig,"key%06d",0xf);
    pfVar21 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11488c;
    sVar12 = strlen(fconfig);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11489b;
    fVar10 = fdb_del_kv(pfVar21,fconfig,sVar12 + 1);
    if (fVar10 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_001148ab;
    }
    goto LAB_00115186;
  default:
switchD_00114596_default:
    pfVar21 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar55 = "value%08d";
    doc_02 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar56 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d43;
      sprintf((char *)pfVar21,"key%06d",(ulong)pfVar56 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d53;
      sprintf(doc_02,"value%08d",(ulong)pfVar56 & 0xffffffff);
      pcVar54 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d60;
      sVar12 = strlen((char *)pfVar21);
      fconfig = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d6c;
      sVar12 = strlen(doc_02);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d81;
      fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar54,pfVar21,(size_t)fconfig,doc_02,sVar12 + 1);
      pfVar52 = pfVar21;
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115099;
      *(undefined4 *)(_Var23._M_i + (long)pfVar56 * 4 + -0x4f8) = 0;
      pfVar56 = (filemgr *)&((fdb_kvs_config *)&pfVar56->filename)->field_0x1;
    } while (pfVar56 != (filemgr *)0x1e);
    pfVar18 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114daa;
    fVar10 = fdb_commit(pfVar18,'\x01');
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00115181;
    pfVar21 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar55 = "value%08d(WAL)";
    doc_02 = (char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x618))->filename;
    pfVar56 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114de0;
      sprintf((char *)pfVar21,"key%06d",(ulong)pfVar56 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114df0;
      sprintf(doc_02,"value%08d(WAL)",(ulong)pfVar56 & 0xffffffff);
      pcVar54 = *(char **)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114dfd;
      sVar12 = strlen((char *)pfVar21);
      fconfig = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e09;
      sVar12 = strlen(doc_02);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e1e;
      fVar10 = fdb_set_kv((fdb_kvs_handle *)pcVar54,pfVar21,(size_t)fconfig,doc_02,sVar12 + 1);
      pcVar59 = (char *)pfVar56;
      if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_001150a8;
      *(undefined4 *)(_Var23._M_i + (long)pfVar56 * 4 + -0x4f8) = 1;
      pfVar56 = (filemgr *)&((fdb_kvs_config *)&pfVar56->filename)->field_0x1;
    } while (pfVar56 != (filemgr *)0x1e);
    if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114e89:
      pfVar18 = *(fdb_file_handle **)
                 ((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e95;
      fVar10 = fdb_commit(pfVar18,'\0');
      if (fVar10 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ea2;
      iterator_complete_test();
switchD_00114745_caseD_5:
      (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114eaf;
      sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
      builtin_strncpy((char *)(_Var23._M_i + (sVar12 - 0x238)),"(HB+trie: empty,",0x10);
      uVar66._0_1_ = 'e';
      uVar66._1_1_ = 'm';
      uVar66._2_1_ = 'p';
      uVar66._3_1_ = 't';
      uVar68._0_1_ = 'y';
      uVar68._1_1_ = ',';
      uVar68._2_1_ = ' ';
      uVar68._3_1_ = 'W';
      uVar70._0_1_ = 'A';
      uVar70._1_1_ = 'L';
      uVar70._2_1_ = ':';
      uVar70._3_1_ = ' ';
      uVar72._0_1_ = 'a';
      uVar72._1_1_ = 'l';
      uVar72._2_1_ = 'l';
      uVar72._3_1_ = '\0';
LAB_00114f12:
      pcVar55 = (char *)(_Var23._M_i + (sVar12 - 0x22e));
      *(undefined4 *)pcVar55 = uVar66;
      *(undefined4 *)(pcVar55 + 4) = uVar68;
      *(undefined4 *)(pcVar55 + 8) = uVar70;
      *(undefined4 *)(pcVar55 + 0xc) = uVar72;
      goto switchD_00114745_default;
    }
    fconfig = (char *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e5d;
    sprintf(fconfig,"key%06d",0xf);
    pfVar21 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e6a;
    sVar12 = strlen(fconfig);
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e79;
    fVar10 = fdb_del_kv(pfVar21,fconfig,sVar12 + 1);
    if (fVar10 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114e89;
    }
    goto LAB_001151a4;
  }
LAB_0011472c:
  switch((int)fconfig) {
  case 1:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114754;
    sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
    *(undefined8 *)(_Var23._M_i + (sVar12 - 0x228)) = 0x64646f203a4c41;
    break;
  case 2:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f2c;
    sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
    builtin_strncpy((char *)(_Var23._M_i + (sVar12 - 0x238)),"(HB+trie: odd, W",0x10);
    uVar65._0_1_ = ' ';
    uVar65._1_1_ = 'o';
    uVar65._2_1_ = 'd';
    uVar65._3_1_ = 'd';
    uVar67._0_1_ = ',';
    uVar67._1_1_ = ' ';
    uVar67._2_1_ = 'W';
    uVar67._3_1_ = 'A';
    uVar69._0_1_ = 'L';
    uVar69._1_1_ = ':';
    uVar69._2_1_ = ' ';
    uVar69._3_1_ = 'e';
    uVar71._0_1_ = 'v';
    uVar71._1_1_ = 'e';
    uVar71._2_1_ = 'n';
    uVar71._3_1_ = '\0';
    goto LAB_0011454a;
  case 3:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ed4;
    sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
    builtin_strncpy((char *)(_Var23._M_i + (sVar12 - 0x238)),"(HB+trie: even, ",0x10);
    uVar65._0_1_ = ' ';
    uVar65._1_1_ = 'e';
    uVar65._2_1_ = 'v';
    uVar65._3_1_ = 'e';
    uVar67._0_1_ = 'n';
    uVar67._1_1_ = ',';
    uVar67._2_1_ = ' ';
    uVar67._3_1_ = 'W';
    uVar69._0_1_ = 'A';
    uVar69._1_1_ = 'L';
    uVar69._2_1_ = ':';
    uVar69._3_1_ = ' ';
    uVar71._0_1_ = 'o';
    uVar71._1_1_ = 'd';
    uVar71._2_1_ = 'd';
    uVar71._3_1_ = '\0';
LAB_0011454a:
    pcVar55 = (char *)(_Var23._M_i + (sVar12 - 0x22f));
    *(undefined4 *)pcVar55 = uVar65;
    *(undefined4 *)(pcVar55 + 4) = uVar67;
    *(undefined4 *)(pcVar55 + 8) = uVar69;
    *(undefined4 *)(pcVar55 + 0xc) = uVar71;
    goto switchD_00114745_default;
  case 4:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114efc;
    sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
    builtin_strncpy((char *)(_Var23._M_i + (sVar12 - 0x238)),"(HB+trie: all, W",0x10);
    uVar66._0_1_ = 'a';
    uVar66._1_1_ = 'l';
    uVar66._2_1_ = 'l';
    uVar66._3_1_ = ',';
    uVar68._0_1_ = ' ';
    uVar68._1_1_ = 'W';
    uVar68._2_1_ = 'A';
    uVar68._3_1_ = 'L';
    uVar70._0_1_ = ':';
    uVar70._1_1_ = ' ';
    uVar70._2_1_ = 'e';
    uVar70._3_1_ = 'm';
    uVar72._0_1_ = 'p';
    uVar72._1_1_ = 't';
    uVar72._2_1_ = 'y';
    uVar72._3_1_ = '\0';
    goto LAB_00114f12;
  case 5:
    goto switchD_00114745_caseD_5;
  case 6:
    (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f54;
    sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
    *(undefined8 *)(_Var23._M_i + (sVar12 - 0x228)) = 0x6c6c61203a4c41;
    break;
  default:
    goto switchD_00114745_default;
  }
  builtin_strncpy((char *)(_Var23._M_i + (sVar12 - 0x238)),"(HB+trie: all, W",0x10);
switchD_00114745_default:
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11455f;
  sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
  pcVar55 = (char *)(_Var23._M_i + (sVar12 - 0x238));
  if (*(int *)((((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).encryption_key.bytes + 0x10) ==
      0) {
    pcVar55[0] = ')';
    pcVar55[1] = '\0';
  }
  else {
    builtin_strncpy(pcVar55,", do",4);
    builtin_strncpy((char *)(_Var23._M_i + (sVar12 - 0x234)),"c de",4);
    builtin_strncpy((char *)(_Var23._M_i + (sVar12 - 0x230)),"leti",4);
    builtin_strncpy((char *)(_Var23._M_i + (sVar12 - 0x22c)),"on)",4);
  }
  pcVar55 = "%s PASSED\n";
  if (iterator_complete_test(int,int)::__test_pass != '\0') {
    pcVar55 = "%s FAILED\n";
  }
  (((fdb_kvs_handle *)(_Var23._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1147ae;
  fprintf(_stderr,pcVar55,&((fdb_kvs_handle *)(_Var23._M_i + -0x410))->node);
  return;
}

Assistant:

void iterator_with_concurrent_updates_test()
{
    // unit test for MB-12287
    TEST_INIT();
    memleak_start();

    int i, n=10;
    int r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db1, *db2, *db3;
    fdb_iterator *itr;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    char keybuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    // open db1, db2, db3 on the same file
    fconfig = fdb_get_default_config();
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    kvs_config = fdb_get_default_kvs_config();
    fdb_open(&dbfile, "./iterator_test1", &fconfig);

    fdb_kvs_open_default(dbfile, &db1, &kvs_config);
    status = fdb_set_log_callback(db1, logCallbackFunc,
                                  (void *) "iterator_concurrent_update_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_open_default(dbfile, &db2, &kvs_config);
    status = fdb_set_log_callback(db2, logCallbackFunc,
                                  (void *) "iterator_concurrent_update_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_open_default(dbfile, &db3, &kvs_config);
    status = fdb_set_log_callback(db3, logCallbackFunc,
                                  (void *) "iterator_concurrent_update_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert docs using db1
    for (i=0;i<10;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf), NULL, 0,
                       (void*)bodybuf, strlen(bodybuf));
        fdb_set(db1, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // create an iterator using db2
    fdb_iterator_init(db2, &itr, NULL, 0, NULL, 0, FDB_ITR_NONE);
    r = 0;
    do {
        status = fdb_iterator_get(itr, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->key, doc[r]->key, rdoc->keylen);
        TEST_CMP(rdoc->body, doc[r]->body, rdoc->bodylen);
        r++;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(itr) == FDB_RESULT_SUCCESS);
    fdb_iterator_close(itr);
    TEST_CHK(r == n);

    // same for sequence number
    fdb_iterator_sequence_init(db3, &itr, 0, 0, FDB_ITR_NONE);
    r = 0;
    do {
        status = fdb_iterator_get(itr, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        r++;
        TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)r);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(itr) == FDB_RESULT_SUCCESS);
    fdb_iterator_close(itr);
    TEST_CHK(r == n);

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator with concurrent updates test");
}